

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<4,4>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,8>,embree::avx512::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  Primitive PVar8;
  uint uVar9;
  undefined4 uVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  int iVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  undefined8 uVar59;
  undefined8 uVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  byte bVar63;
  ulong uVar64;
  uint uVar65;
  uint uVar66;
  int iVar67;
  ulong uVar68;
  uint uVar69;
  long lVar70;
  Geometry *pGVar71;
  ulong uVar72;
  byte bVar73;
  ulong uVar74;
  float fVar75;
  float fVar76;
  float fVar128;
  float fVar130;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar85 [16];
  float fVar129;
  float fVar131;
  float fVar133;
  float fVar134;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  float fVar132;
  float fVar135;
  float fVar136;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined4 uVar137;
  float fVar150;
  float fVar151;
  vint4 bi_2;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar152;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  vint4 bi_1;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  float fVar156;
  vint4 bi;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  float fVar164;
  float fVar180;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  vint4 ai_2;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [64];
  vint4 ai;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [64];
  vint4 ai_1;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [64];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [64];
  undefined1 auVar205 [16];
  undefined1 auVar206 [64];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar217 [64];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  RTCFilterFunctionNArguments args;
  float local_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  RTCFilterFunctionNArguments local_5a0;
  undefined1 local_570 [16];
  undefined1 local_560 [16];
  ulong local_548;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [32];
  undefined8 local_4c0;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined4 local_420;
  undefined4 uStack_41c;
  undefined4 uStack_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  int local_3f0;
  int iStack_3ec;
  int iStack_3e8;
  int iStack_3e4;
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined4 local_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined1 local_390 [16];
  uint local_380;
  uint uStack_37c;
  uint uStack_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint uStack_368;
  uint uStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined4 uStack_344;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined4 local_200;
  int local_1fc;
  undefined1 local_1f0 [16];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_130 [16];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar216 [64];
  
  PVar8 = prim[1];
  uVar68 = (ulong)(byte)PVar8;
  fVar156 = *(float *)(prim + uVar68 * 0x19 + 0x12);
  auVar80 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar80 = vinsertps_avx(auVar80,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar78 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar78 = vinsertps_avx(auVar78,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar80 = vsubps_avx(auVar80,*(undefined1 (*) [16])(prim + uVar68 * 0x19 + 6));
  auVar165._0_4_ = fVar156 * auVar80._0_4_;
  auVar165._4_4_ = fVar156 * auVar80._4_4_;
  auVar165._8_4_ = fVar156 * auVar80._8_4_;
  auVar165._12_4_ = fVar156 * auVar80._12_4_;
  auVar138._0_4_ = fVar156 * auVar78._0_4_;
  auVar138._4_4_ = fVar156 * auVar78._4_4_;
  auVar138._8_4_ = fVar156 * auVar78._8_4_;
  auVar138._12_4_ = fVar156 * auVar78._12_4_;
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 4 + 6)));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 5 + 6)));
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar139 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 6 + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0xb + 6)));
  auVar139 = vcvtdq2ps_avx(auVar139);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar8 * 0xc + uVar68 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  uVar72 = (ulong)(uint)((int)(uVar68 * 9) * 2);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + uVar68 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  uVar64 = (ulong)(uint)((int)(uVar68 * 5) << 2);
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 + 6)));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar209._4_4_ = auVar138._0_4_;
  auVar209._0_4_ = auVar138._0_4_;
  auVar209._8_4_ = auVar138._0_4_;
  auVar209._12_4_ = auVar138._0_4_;
  auVar23 = vshufps_avx(auVar138,auVar138,0x55);
  auVar79 = vshufps_avx(auVar138,auVar138,0xaa);
  fVar156 = auVar79._0_4_;
  auVar157._0_4_ = fVar156 * auVar139._0_4_;
  fVar150 = auVar79._4_4_;
  auVar157._4_4_ = fVar150 * auVar139._4_4_;
  fVar151 = auVar79._8_4_;
  auVar157._8_4_ = fVar151 * auVar139._8_4_;
  fVar152 = auVar79._12_4_;
  auVar157._12_4_ = fVar152 * auVar139._12_4_;
  auVar153._0_4_ = auVar20._0_4_ * fVar156;
  auVar153._4_4_ = auVar20._4_4_ * fVar150;
  auVar153._8_4_ = auVar20._8_4_ * fVar151;
  auVar153._12_4_ = auVar20._12_4_ * fVar152;
  auVar82._0_4_ = auVar84._0_4_ * fVar156;
  auVar82._4_4_ = auVar84._4_4_ * fVar150;
  auVar82._8_4_ = auVar84._8_4_ * fVar151;
  auVar82._12_4_ = auVar84._12_4_ * fVar152;
  auVar79 = vfmadd231ps_fma(auVar157,auVar23,auVar78);
  auVar81 = vfmadd231ps_fma(auVar153,auVar23,auVar19);
  auVar23 = vfmadd231ps_fma(auVar82,auVar22,auVar23);
  auVar77 = vfmadd231ps_fma(auVar79,auVar209,auVar80);
  auVar81 = vfmadd231ps_fma(auVar81,auVar209,auVar18);
  auVar138 = vfmadd231ps_fma(auVar23,auVar21,auVar209);
  auVar210._4_4_ = auVar165._0_4_;
  auVar210._0_4_ = auVar165._0_4_;
  auVar210._8_4_ = auVar165._0_4_;
  auVar210._12_4_ = auVar165._0_4_;
  auVar23 = vshufps_avx(auVar165,auVar165,0x55);
  auVar79 = vshufps_avx(auVar165,auVar165,0xaa);
  fVar156 = auVar79._0_4_;
  auVar211._0_4_ = fVar156 * auVar139._0_4_;
  fVar150 = auVar79._4_4_;
  auVar211._4_4_ = fVar150 * auVar139._4_4_;
  fVar151 = auVar79._8_4_;
  auVar211._8_4_ = fVar151 * auVar139._8_4_;
  fVar152 = auVar79._12_4_;
  auVar211._12_4_ = fVar152 * auVar139._12_4_;
  auVar181._0_4_ = auVar20._0_4_ * fVar156;
  auVar181._4_4_ = auVar20._4_4_ * fVar150;
  auVar181._8_4_ = auVar20._8_4_ * fVar151;
  auVar181._12_4_ = auVar20._12_4_ * fVar152;
  auVar166._0_4_ = auVar84._0_4_ * fVar156;
  auVar166._4_4_ = auVar84._4_4_ * fVar150;
  auVar166._8_4_ = auVar84._8_4_ * fVar151;
  auVar166._12_4_ = auVar84._12_4_ * fVar152;
  auVar78 = vfmadd231ps_fma(auVar211,auVar23,auVar78);
  auVar139 = vfmadd231ps_fma(auVar181,auVar23,auVar19);
  auVar19 = vfmadd231ps_fma(auVar166,auVar23,auVar22);
  auVar20 = vfmadd231ps_fma(auVar78,auVar210,auVar80);
  auVar22 = vfmadd231ps_fma(auVar139,auVar210,auVar18);
  auVar197._8_4_ = 0x7fffffff;
  auVar197._0_8_ = 0x7fffffff7fffffff;
  auVar197._12_4_ = 0x7fffffff;
  auVar84 = vfmadd231ps_fma(auVar19,auVar210,auVar21);
  auVar80 = vandps_avx(auVar77,auVar197);
  auVar194._8_4_ = 0x219392ef;
  auVar194._0_8_ = 0x219392ef219392ef;
  auVar194._12_4_ = 0x219392ef;
  uVar72 = vcmpps_avx512vl(auVar80,auVar194,1);
  bVar12 = (bool)((byte)uVar72 & 1);
  auVar79._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar77._0_4_;
  bVar12 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar79._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar77._4_4_;
  bVar12 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar79._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar77._8_4_;
  bVar12 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar79._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar77._12_4_;
  auVar80 = vandps_avx(auVar81,auVar197);
  uVar72 = vcmpps_avx512vl(auVar80,auVar194,1);
  bVar12 = (bool)((byte)uVar72 & 1);
  auVar77._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar81._0_4_;
  bVar12 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar77._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar81._4_4_;
  bVar12 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar77._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar81._8_4_;
  bVar12 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar77._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar81._12_4_;
  auVar80 = vandps_avx(auVar138,auVar197);
  uVar72 = vcmpps_avx512vl(auVar80,auVar194,1);
  bVar12 = (bool)((byte)uVar72 & 1);
  auVar81._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar138._0_4_;
  bVar12 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar81._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar138._4_4_;
  bVar12 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar81._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar138._8_4_;
  bVar12 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar81._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar138._12_4_;
  auVar78 = vrcp14ps_avx512vl(auVar79);
  auVar195._8_4_ = 0x3f800000;
  auVar195._0_8_ = 0x3f8000003f800000;
  auVar195._12_4_ = 0x3f800000;
  auVar80 = vfnmadd213ps_fma(auVar79,auVar78,auVar195);
  auVar18 = vfmadd132ps_fma(auVar80,auVar78,auVar78);
  auVar78 = vrcp14ps_avx512vl(auVar77);
  auVar80 = vfnmadd213ps_fma(auVar77,auVar78,auVar195);
  auVar19 = vfmadd132ps_fma(auVar80,auVar78,auVar78);
  auVar78 = vrcp14ps_avx512vl(auVar81);
  auVar80 = vfnmadd213ps_fma(auVar81,auVar78,auVar195);
  auVar21 = vfmadd132ps_fma(auVar80,auVar78,auVar78);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar68 * 7 + 6);
  auVar80 = vpmovsxwd_avx(auVar80);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar20);
  auVar188._0_4_ = auVar18._0_4_ * auVar80._0_4_;
  auVar188._4_4_ = auVar18._4_4_ * auVar80._4_4_;
  auVar188._8_4_ = auVar18._8_4_ * auVar80._8_4_;
  auVar188._12_4_ = auVar18._12_4_ * auVar80._12_4_;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar68 * 9 + 6);
  auVar80 = vpmovsxwd_avx(auVar78);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar20);
  auVar79 = vpbroadcastd_avx512vl();
  auVar139._8_8_ = 0;
  auVar139._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar78 = vpmovsxwd_avx(auVar139);
  auVar158._0_4_ = auVar18._0_4_ * auVar80._0_4_;
  auVar158._4_4_ = auVar18._4_4_ * auVar80._4_4_;
  auVar158._8_4_ = auVar18._8_4_ * auVar80._8_4_;
  auVar158._12_4_ = auVar18._12_4_ * auVar80._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar68 * -2 + 6);
  auVar80 = vpmovsxwd_avx(auVar18);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar22);
  auVar196._0_4_ = auVar19._0_4_ * auVar80._0_4_;
  auVar196._4_4_ = auVar19._4_4_ * auVar80._4_4_;
  auVar196._8_4_ = auVar19._8_4_ * auVar80._8_4_;
  auVar196._12_4_ = auVar19._12_4_ * auVar80._12_4_;
  auVar80 = vcvtdq2ps_avx(auVar78);
  auVar80 = vsubps_avx(auVar80,auVar22);
  auVar85._0_4_ = auVar19._0_4_ * auVar80._0_4_;
  auVar85._4_4_ = auVar19._4_4_ * auVar80._4_4_;
  auVar85._8_4_ = auVar19._8_4_ * auVar80._8_4_;
  auVar85._12_4_ = auVar19._12_4_ * auVar80._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar64 + uVar68 + 6);
  auVar80 = vpmovsxwd_avx(auVar19);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar84);
  auVar182._0_4_ = auVar21._0_4_ * auVar80._0_4_;
  auVar182._4_4_ = auVar21._4_4_ * auVar80._4_4_;
  auVar182._8_4_ = auVar21._8_4_ * auVar80._8_4_;
  auVar182._12_4_ = auVar21._12_4_ * auVar80._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar68 * 0x17 + 6);
  auVar80 = vpmovsxwd_avx(auVar20);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar84);
  auVar83._0_4_ = auVar21._0_4_ * auVar80._0_4_;
  auVar83._4_4_ = auVar21._4_4_ * auVar80._4_4_;
  auVar83._8_4_ = auVar21._8_4_ * auVar80._8_4_;
  auVar83._12_4_ = auVar21._12_4_ * auVar80._12_4_;
  auVar80 = vpminsd_avx(auVar188,auVar158);
  auVar78 = vpminsd_avx(auVar196,auVar85);
  auVar80 = vmaxps_avx(auVar80,auVar78);
  auVar78 = vpminsd_avx(auVar182,auVar83);
  uVar137 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar21._4_4_ = uVar137;
  auVar21._0_4_ = uVar137;
  auVar21._8_4_ = uVar137;
  auVar21._12_4_ = uVar137;
  auVar78 = vmaxps_avx512vl(auVar78,auVar21);
  auVar80 = vmaxps_avx(auVar80,auVar78);
  auVar22._8_4_ = 0x3f7ffffa;
  auVar22._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar22._12_4_ = 0x3f7ffffa;
  local_130 = vmulps_avx512vl(auVar80,auVar22);
  auVar80 = vpmaxsd_avx(auVar188,auVar158);
  auVar78 = vpmaxsd_avx(auVar196,auVar85);
  auVar80 = vminps_avx(auVar80,auVar78);
  auVar78 = vpmaxsd_avx(auVar182,auVar83);
  uVar137 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar84._4_4_ = uVar137;
  auVar84._0_4_ = uVar137;
  auVar84._8_4_ = uVar137;
  auVar84._12_4_ = uVar137;
  auVar78 = vminps_avx512vl(auVar78,auVar84);
  auVar80 = vminps_avx(auVar80,auVar78);
  auVar23._8_4_ = 0x3f800003;
  auVar23._0_8_ = 0x3f8000033f800003;
  auVar23._12_4_ = 0x3f800003;
  auVar80 = vmulps_avx512vl(auVar80,auVar23);
  uVar24 = vcmpps_avx512vl(local_130,auVar80,2);
  uVar72 = vpcmpgtd_avx512vl(auVar79,_DAT_01f7fcf0);
  uVar72 = ((byte)uVar24 & 0xf) & uVar72;
  if ((char)uVar72 != '\0') {
    local_4f0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    do {
      lVar27 = 0;
      for (uVar64 = uVar72; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
        lVar27 = lVar27 + 1;
      }
      uVar69 = *(uint *)(prim + 2);
      uVar9 = *(uint *)(prim + lVar27 * 4 + 6);
      pGVar71 = (context->scene->geometries).items[uVar69].ptr;
      uVar64 = (ulong)*(uint *)(*(long *)&pGVar71->field_0x58 +
                               pGVar71[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * (ulong)uVar9);
      p_Var11 = pGVar71[1].intersectionFilterN;
      lVar27 = *(long *)&pGVar71[1].time_range.upper;
      local_5b0 = *(undefined1 (*) [16])(lVar27 + (long)p_Var11 * uVar64);
      pauVar3 = (undefined1 (*) [16])(lVar27 + (uVar64 + 1) * (long)p_Var11);
      uVar24 = *(undefined8 *)*pauVar3;
      uVar56 = *(undefined8 *)(*pauVar3 + 8);
      auVar22 = *pauVar3;
      auVar20 = *pauVar3;
      auVar18 = *pauVar3;
      auVar80 = *pauVar3;
      pauVar4 = (undefined1 (*) [16])(lVar27 + (uVar64 + 2) * (long)p_Var11);
      uVar57 = *(undefined8 *)*pauVar4;
      uVar58 = *(undefined8 *)(*pauVar4 + 8);
      auVar21 = *pauVar4;
      auVar19 = *pauVar4;
      auVar139 = *pauVar4;
      auVar78 = *pauVar4;
      uVar72 = uVar72 - 1 & uVar72;
      pauVar5 = (undefined1 (*) [12])(lVar27 + (uVar64 + 3) * (long)p_Var11);
      uVar59 = *(undefined8 *)*pauVar5;
      uVar60 = *(undefined8 *)(*pauVar5 + 8);
      local_5f0 = (float)uVar59;
      fStack_5ec = (float)((ulong)uVar59 >> 0x20);
      fStack_5e8 = (float)uVar60;
      fStack_5e4 = (float)((ulong)uVar60 >> 0x20);
      if (uVar72 != 0) {
        uVar68 = uVar72 - 1 & uVar72;
        for (uVar64 = uVar72; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
        }
        if (uVar68 != 0) {
          for (; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar67 = (int)pGVar71[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar84 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10))
                              ,0x1c);
      auVar84 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar79 = vsubps_avx(local_5b0,auVar84);
      uVar137 = auVar79._0_4_;
      auVar159._4_4_ = uVar137;
      auVar159._0_4_ = uVar137;
      auVar159._8_4_ = uVar137;
      auVar159._12_4_ = uVar137;
      auVar23 = vshufps_avx(auVar79,auVar79,0x55);
      auVar79 = vshufps_avx(auVar79,auVar79,0xaa);
      aVar6 = pre->ray_space[k].vx.field_0;
      aVar7 = pre->ray_space[k].vy.field_0;
      fVar156 = pre->ray_space[k].vz.field_0.m128[0];
      fVar150 = pre->ray_space[k].vz.field_0.m128[1];
      fVar151 = pre->ray_space[k].vz.field_0.m128[2];
      fVar152 = pre->ray_space[k].vz.field_0.m128[3];
      auVar200._0_4_ = fVar156 * auVar79._0_4_;
      auVar200._4_4_ = fVar150 * auVar79._4_4_;
      auVar200._8_4_ = fVar151 * auVar79._8_4_;
      auVar200._12_4_ = fVar152 * auVar79._12_4_;
      auVar23 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar7,auVar23);
      auVar77 = vfmadd231ps_fma(auVar23,(undefined1  [16])aVar6,auVar159);
      auVar23 = vshufps_avx(local_5b0,local_5b0,0xff);
      auVar81 = vsubps_avx512vl(auVar80,auVar84);
      uVar137 = auVar81._0_4_;
      auVar167._4_4_ = uVar137;
      auVar167._0_4_ = uVar137;
      auVar167._8_4_ = uVar137;
      auVar167._12_4_ = uVar137;
      auVar79 = vshufps_avx(auVar81,auVar81,0x55);
      auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
      auVar201._0_4_ = fVar156 * auVar81._0_4_;
      auVar201._4_4_ = fVar150 * auVar81._4_4_;
      auVar201._8_4_ = fVar151 * auVar81._8_4_;
      auVar201._12_4_ = fVar152 * auVar81._12_4_;
      auVar79 = vfmadd231ps_fma(auVar201,(undefined1  [16])aVar7,auVar79);
      auVar138 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar6,auVar167);
      auVar82 = vshufps_avx512vl(auVar80,auVar80,0xff);
      auVar81 = vsubps_avx512vl(auVar78,auVar84);
      uVar137 = auVar81._0_4_;
      auVar198._4_4_ = uVar137;
      auVar198._0_4_ = uVar137;
      auVar198._8_4_ = uVar137;
      auVar198._12_4_ = uVar137;
      auVar79 = vshufps_avx(auVar81,auVar81,0x55);
      auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
      auVar205._0_4_ = fVar156 * auVar81._0_4_;
      auVar205._4_4_ = fVar150 * auVar81._4_4_;
      auVar205._8_4_ = fVar151 * auVar81._8_4_;
      auVar205._12_4_ = fVar152 * auVar81._12_4_;
      auVar79 = vfmadd231ps_fma(auVar205,(undefined1  [16])aVar7,auVar79);
      auVar81 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar6,auVar198);
      auVar83 = vshufps_avx512vl(auVar78,auVar78,0xff);
      auVar61._12_4_ = fStack_5e4;
      auVar61._0_12_ = *pauVar5;
      auVar79 = vsubps_avx512vl(auVar61,auVar84);
      uVar137 = auVar79._0_4_;
      auVar168._4_4_ = uVar137;
      auVar168._0_4_ = uVar137;
      auVar168._8_4_ = uVar137;
      auVar168._12_4_ = uVar137;
      auVar84 = vshufps_avx(auVar79,auVar79,0x55);
      auVar79 = vshufps_avx(auVar79,auVar79,0xaa);
      auVar207._0_4_ = fVar156 * auVar79._0_4_;
      auVar207._4_4_ = fVar150 * auVar79._4_4_;
      auVar207._8_4_ = fVar151 * auVar79._8_4_;
      auVar207._12_4_ = fVar152 * auVar79._12_4_;
      auVar84 = vfmadd231ps_fma(auVar207,(undefined1  [16])aVar7,auVar84);
      auVar79 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar6,auVar168);
      lVar27 = (long)iVar67 * 0x44;
      auVar101 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27);
      auVar84 = vshufps_avx512vl(auVar61,auVar61,0xff);
      uVar137 = auVar77._0_4_;
      local_280._4_4_ = uVar137;
      local_280._0_4_ = uVar137;
      local_280._8_4_ = uVar137;
      local_280._12_4_ = uVar137;
      local_280._16_4_ = uVar137;
      local_280._20_4_ = uVar137;
      local_280._24_4_ = uVar137;
      local_280._28_4_ = uVar137;
      auVar86._8_4_ = 1;
      auVar86._0_8_ = 0x100000001;
      auVar86._12_4_ = 1;
      auVar86._16_4_ = 1;
      auVar86._20_4_ = 1;
      auVar86._24_4_ = 1;
      auVar86._28_4_ = 1;
      local_2a0 = vpermps_avx2(auVar86,ZEXT1632(auVar77));
      local_80 = vbroadcastsd_avx512vl(auVar23);
      auVar102 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x484);
      uVar137 = auVar138._0_4_;
      auVar154._4_4_ = uVar137;
      auVar154._0_4_ = uVar137;
      auVar154._8_4_ = uVar137;
      auVar154._12_4_ = uVar137;
      local_2c0._16_4_ = uVar137;
      local_2c0._0_16_ = auVar154;
      local_2c0._20_4_ = uVar137;
      local_2c0._24_4_ = uVar137;
      local_2c0._28_4_ = uVar137;
      local_2e0 = vpermps_avx512vl(auVar86,ZEXT1632(auVar138));
      local_a0 = vbroadcastsd_avx512vl(auVar82);
      auVar100 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x908);
      uVar137 = auVar81._0_4_;
      local_300._4_4_ = uVar137;
      local_300._0_4_ = uVar137;
      local_300._8_4_ = uVar137;
      local_300._12_4_ = uVar137;
      local_300._16_4_ = uVar137;
      local_300._20_4_ = uVar137;
      local_300._24_4_ = uVar137;
      local_300._28_4_ = uVar137;
      local_320 = vpermps_avx512vl(auVar86,ZEXT1632(auVar81));
      local_c0 = vbroadcastsd_avx512vl(auVar83);
      auVar99 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0xd8c);
      fVar150 = auVar79._0_4_;
      local_340._4_4_ = fVar150;
      local_340._0_4_ = fVar150;
      fStack_338 = fVar150;
      fStack_334 = fVar150;
      fStack_330 = fVar150;
      fStack_32c = fVar150;
      fStack_328 = fVar150;
      register0x0000139c = fVar150;
      _local_360 = vpermps_avx512vl(auVar86,ZEXT1632(auVar79));
      local_e0 = vbroadcastsd_avx512vl(auVar84);
      auVar86 = vmulps_avx512vl(_local_340,auVar99);
      auVar87 = vmulps_avx512vl(_local_360,auVar99);
      auVar84 = vfmadd231ps_fma(auVar86,auVar100,local_300);
      auVar86 = vfmadd231ps_avx512vl(auVar87,auVar100,local_320);
      auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar102,local_2c0);
      auVar88 = vfmadd231ps_avx512vl(auVar86,auVar102,local_2e0);
      auVar89 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar101,local_280);
      auVar193 = ZEXT3264(auVar89);
      auVar86 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27);
      auVar87 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x484);
      auVar90 = vfmadd231ps_avx512vl(auVar88,auVar101,local_2a0);
      auVar187 = ZEXT3264(auVar90);
      auVar88 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x908);
      auVar98 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0xd8c);
      auVar91 = vmulps_avx512vl(_local_340,auVar98);
      auVar92 = vmulps_avx512vl(_local_360,auVar98);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar88,local_300);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar88,local_320);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar87,local_2c0);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar87,local_2e0);
      auVar23 = vfmadd231ps_fma(auVar91,auVar86,local_280);
      auVar199 = ZEXT1664(auVar23);
      auVar82 = vfmadd231ps_fma(auVar92,auVar86,local_2a0);
      auVar91 = vsubps_avx512vl(ZEXT1632(auVar23),auVar89);
      auVar92 = vsubps_avx512vl(ZEXT1632(auVar82),auVar90);
      auVar93 = vmulps_avx512vl(auVar90,auVar91);
      auVar94 = vmulps_avx512vl(auVar89,auVar92);
      auVar93 = vsubps_avx512vl(auVar93,auVar94);
      auVar94 = vmulps_avx512vl(local_e0,auVar99);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar100,local_c0);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar102,local_a0);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar101,local_80);
      auVar95 = vmulps_avx512vl(local_e0,auVar98);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar88,local_c0);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar87,local_a0);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar86,local_80);
      auVar96 = vmulps_avx512vl(auVar92,auVar92);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar91,auVar91);
      auVar97 = vmaxps_avx512vl(auVar94,auVar95);
      auVar97 = vmulps_avx512vl(auVar97,auVar97);
      auVar96 = vmulps_avx512vl(auVar97,auVar96);
      auVar93 = vmulps_avx512vl(auVar93,auVar93);
      uVar25 = vcmpps_avx512vl(auVar93,auVar96,2);
      auVar84 = vblendps_avx(auVar77,local_5b0,8);
      auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar84 = vandps_avx512vl(auVar84,auVar83);
      auVar80 = vblendps_avx(auVar138,auVar80,8);
      auVar80 = vandps_avx512vl(auVar80,auVar83);
      auVar84 = vmaxps_avx(auVar84,auVar80);
      auVar80 = vblendps_avx(auVar81,auVar78,8);
      auVar78 = vandps_avx512vl(auVar80,auVar83);
      auVar80 = vblendps_avx(auVar79,auVar61,8);
      auVar80 = vandps_avx512vl(auVar80,auVar83);
      auVar80 = vmaxps_avx(auVar78,auVar80);
      auVar80 = vmaxps_avx(auVar84,auVar80);
      auVar78 = vmovshdup_avx(auVar80);
      auVar78 = vmaxss_avx(auVar78,auVar80);
      auVar80 = vshufpd_avx(auVar80,auVar80,1);
      auVar80 = vmaxss_avx(auVar80,auVar78);
      local_570._0_4_ = (undefined4)iVar67;
      local_570._4_12_ = auVar77._4_12_;
      auVar93._4_4_ = local_570._0_4_;
      auVar93._0_4_ = local_570._0_4_;
      auVar93._8_4_ = local_570._0_4_;
      auVar93._12_4_ = local_570._0_4_;
      auVar93._16_4_ = local_570._0_4_;
      auVar93._20_4_ = local_570._0_4_;
      auVar93._24_4_ = local_570._0_4_;
      auVar93._28_4_ = local_570._0_4_;
      uVar26 = vcmpps_avx512vl(auVar93,_DAT_01faff40,0xe);
      bVar73 = (byte)uVar25 & (byte)uVar26;
      fVar156 = auVar80._0_4_ * 4.7683716e-07;
      local_520._0_16_ = ZEXT416((uint)fVar156);
      auVar96._8_4_ = 2;
      auVar96._0_8_ = 0x200000002;
      auVar96._12_4_ = 2;
      auVar96._16_4_ = 2;
      auVar96._20_4_ = 2;
      auVar96._24_4_ = 2;
      auVar96._28_4_ = 2;
      local_480 = vpermps_avx512vl(auVar96,ZEXT1632(auVar77));
      auVar217 = ZEXT3264(local_480);
      local_4a0 = vpermps_avx512vl(auVar96,ZEXT1632(auVar138));
      auVar219 = ZEXT3264(local_4a0);
      auVar93 = vpermps_avx512vl(auVar96,ZEXT1632(auVar81));
      local_120 = vpermps_avx2(auVar96,ZEXT1632(auVar79));
      local_420 = *(undefined4 *)(ray + k * 4 + 0x30);
      uStack_41c = 0;
      uStack_418 = 0;
      uStack_414 = 0;
      if (bVar73 != 0) {
        auVar98 = vmulps_avx512vl(local_120,auVar98);
        auVar88 = vfmadd213ps_avx512vl(auVar88,auVar93,auVar98);
        auVar87 = vfmadd213ps_avx512vl(auVar87,local_4a0,auVar88);
        auVar96 = vfmadd213ps_avx512vl(auVar86,local_480,auVar87);
        auVar99 = vmulps_avx512vl(local_120,auVar99);
        auVar100 = vfmadd213ps_avx512vl(auVar100,auVar93,auVar99);
        auVar87 = vfmadd213ps_avx512vl(auVar102,local_4a0,auVar100);
        auVar102 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x1210);
        auVar100 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x1694);
        auVar99 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x1b18);
        auVar86 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x1f9c);
        auVar97 = vfmadd213ps_avx512vl(auVar101,local_480,auVar87);
        auVar202._0_4_ = fVar150 * auVar86._0_4_;
        auVar202._4_4_ = fVar150 * auVar86._4_4_;
        auVar202._8_4_ = fVar150 * auVar86._8_4_;
        auVar202._12_4_ = fVar150 * auVar86._12_4_;
        auVar202._16_4_ = fVar150 * auVar86._16_4_;
        auVar202._20_4_ = fVar150 * auVar86._20_4_;
        auVar202._24_4_ = fVar150 * auVar86._24_4_;
        auVar202._28_4_ = 0;
        auVar101 = vmulps_avx512vl(_local_360,auVar86);
        auVar86 = vmulps_avx512vl(local_120,auVar86);
        auVar87 = vfmadd231ps_avx512vl(auVar202,auVar99,local_300);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar99,local_320);
        auVar99 = vfmadd231ps_avx512vl(auVar86,auVar93,auVar99);
        auVar86 = vfmadd231ps_avx512vl(auVar87,auVar100,local_2c0);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar100,local_2e0);
        auVar87 = vfmadd231ps_avx512vl(auVar99,local_4a0,auVar100);
        auVar80 = vfmadd231ps_fma(auVar86,auVar102,local_280);
        auVar86 = vfmadd231ps_avx512vl(auVar101,auVar102,local_2a0);
        auVar101 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x1210);
        auVar100 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x1b18);
        auVar99 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x1f9c);
        auVar88 = vfmadd231ps_avx512vl(auVar87,local_480,auVar102);
        auVar87._4_4_ = fVar150 * auVar99._4_4_;
        auVar87._0_4_ = fVar150 * auVar99._0_4_;
        auVar87._8_4_ = fVar150 * auVar99._8_4_;
        auVar87._12_4_ = fVar150 * auVar99._12_4_;
        auVar87._16_4_ = fVar150 * auVar99._16_4_;
        auVar87._20_4_ = fVar150 * auVar99._20_4_;
        auVar87._24_4_ = fVar150 * auVar99._24_4_;
        auVar87._28_4_ = auVar102._28_4_;
        auVar102 = vmulps_avx512vl(_local_360,auVar99);
        auVar99 = vmulps_avx512vl(local_120,auVar99);
        auVar87 = vfmadd231ps_avx512vl(auVar87,auVar100,local_300);
        auVar98 = vfmadd231ps_avx512vl(auVar102,auVar100,local_320);
        auVar217 = ZEXT3264(local_480);
        auVar219 = ZEXT3264(local_4a0);
        auVar218 = ZEXT3264(auVar93);
        auVar100 = vfmadd231ps_avx512vl(auVar99,auVar93,auVar100);
        auVar102 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x1694);
        auVar99 = vfmadd231ps_avx512vl(auVar87,auVar102,local_2c0);
        auVar87 = vfmadd231ps_avx512vl(auVar98,auVar102,local_2e0);
        auVar102 = vfmadd231ps_avx512vl(auVar100,local_4a0,auVar102);
        auVar78 = vfmadd231ps_fma(auVar99,auVar101,local_280);
        auVar100 = vfmadd231ps_avx512vl(auVar87,auVar101,local_2a0);
        auVar99 = vfmadd231ps_avx512vl(auVar102,local_480,auVar101);
        auVar212._8_4_ = 0x7fffffff;
        auVar212._0_8_ = 0x7fffffff7fffffff;
        auVar212._12_4_ = 0x7fffffff;
        auVar212._16_4_ = 0x7fffffff;
        auVar212._20_4_ = 0x7fffffff;
        auVar212._24_4_ = 0x7fffffff;
        auVar212._28_4_ = 0x7fffffff;
        auVar101 = vandps_avx(ZEXT1632(auVar80),auVar212);
        auVar102 = vandps_avx(auVar86,auVar212);
        auVar102 = vmaxps_avx(auVar101,auVar102);
        auVar101 = vandps_avx(auVar88,auVar212);
        auVar101 = vmaxps_avx(auVar102,auVar101);
        auVar208._4_4_ = fVar156;
        auVar208._0_4_ = fVar156;
        auVar208._8_4_ = fVar156;
        auVar208._12_4_ = fVar156;
        auVar208._16_4_ = fVar156;
        auVar208._20_4_ = fVar156;
        auVar208._24_4_ = fVar156;
        auVar208._28_4_ = fVar156;
        uVar64 = vcmpps_avx512vl(auVar101,auVar208,1);
        bVar12 = (bool)((byte)uVar64 & 1);
        auVar103._0_4_ = (float)((uint)bVar12 * auVar91._0_4_ | (uint)!bVar12 * auVar80._0_4_);
        bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar103._4_4_ = (float)((uint)bVar12 * auVar91._4_4_ | (uint)!bVar12 * auVar80._4_4_);
        bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar103._8_4_ = (float)((uint)bVar12 * auVar91._8_4_ | (uint)!bVar12 * auVar80._8_4_);
        bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar103._12_4_ = (float)((uint)bVar12 * auVar91._12_4_ | (uint)!bVar12 * auVar80._12_4_);
        fVar151 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar91._16_4_);
        auVar103._16_4_ = fVar151;
        fVar156 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar91._20_4_);
        auVar103._20_4_ = fVar156;
        fVar150 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar91._24_4_);
        auVar103._24_4_ = fVar150;
        uVar65 = (uint)(byte)(uVar64 >> 7) * auVar91._28_4_;
        auVar103._28_4_ = uVar65;
        bVar12 = (bool)((byte)uVar64 & 1);
        auVar104._0_4_ = (float)((uint)bVar12 * auVar92._0_4_ | (uint)!bVar12 * auVar86._0_4_);
        bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar104._4_4_ = (float)((uint)bVar12 * auVar92._4_4_ | (uint)!bVar12 * auVar86._4_4_);
        bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar104._8_4_ = (float)((uint)bVar12 * auVar92._8_4_ | (uint)!bVar12 * auVar86._8_4_);
        bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar104._12_4_ = (float)((uint)bVar12 * auVar92._12_4_ | (uint)!bVar12 * auVar86._12_4_);
        bVar12 = (bool)((byte)(uVar64 >> 4) & 1);
        auVar104._16_4_ = (float)((uint)bVar12 * auVar92._16_4_ | (uint)!bVar12 * auVar86._16_4_);
        bVar12 = (bool)((byte)(uVar64 >> 5) & 1);
        auVar104._20_4_ = (float)((uint)bVar12 * auVar92._20_4_ | (uint)!bVar12 * auVar86._20_4_);
        bVar12 = (bool)((byte)(uVar64 >> 6) & 1);
        auVar104._24_4_ = (float)((uint)bVar12 * auVar92._24_4_ | (uint)!bVar12 * auVar86._24_4_);
        bVar12 = SUB81(uVar64 >> 7,0);
        auVar104._28_4_ = (uint)bVar12 * auVar92._28_4_ | (uint)!bVar12 * auVar86._28_4_;
        auVar101 = vandps_avx(auVar212,ZEXT1632(auVar78));
        auVar102 = vandps_avx(auVar100,auVar212);
        auVar102 = vmaxps_avx(auVar101,auVar102);
        auVar101 = vandps_avx(auVar99,auVar212);
        auVar101 = vmaxps_avx(auVar102,auVar101);
        uVar64 = vcmpps_avx512vl(auVar101,auVar208,1);
        bVar12 = (bool)((byte)uVar64 & 1);
        auVar105._0_4_ = (float)((uint)bVar12 * auVar91._0_4_ | (uint)!bVar12 * auVar78._0_4_);
        bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar105._4_4_ = (float)((uint)bVar12 * auVar91._4_4_ | (uint)!bVar12 * auVar78._4_4_);
        bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar105._8_4_ = (float)((uint)bVar12 * auVar91._8_4_ | (uint)!bVar12 * auVar78._8_4_);
        bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar105._12_4_ = (float)((uint)bVar12 * auVar91._12_4_ | (uint)!bVar12 * auVar78._12_4_);
        fVar180 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar91._16_4_);
        auVar105._16_4_ = fVar180;
        fVar164 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar91._20_4_);
        auVar105._20_4_ = fVar164;
        fVar152 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar91._24_4_);
        auVar105._24_4_ = fVar152;
        auVar105._28_4_ = (uint)(byte)(uVar64 >> 7) * auVar91._28_4_;
        bVar12 = (bool)((byte)uVar64 & 1);
        auVar106._0_4_ = (float)((uint)bVar12 * auVar92._0_4_ | (uint)!bVar12 * auVar100._0_4_);
        bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar106._4_4_ = (float)((uint)bVar12 * auVar92._4_4_ | (uint)!bVar12 * auVar100._4_4_);
        bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar106._8_4_ = (float)((uint)bVar12 * auVar92._8_4_ | (uint)!bVar12 * auVar100._8_4_);
        bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar106._12_4_ = (float)((uint)bVar12 * auVar92._12_4_ | (uint)!bVar12 * auVar100._12_4_);
        bVar12 = (bool)((byte)(uVar64 >> 4) & 1);
        auVar106._16_4_ = (float)((uint)bVar12 * auVar92._16_4_ | (uint)!bVar12 * auVar100._16_4_);
        bVar12 = (bool)((byte)(uVar64 >> 5) & 1);
        auVar106._20_4_ = (float)((uint)bVar12 * auVar92._20_4_ | (uint)!bVar12 * auVar100._20_4_);
        bVar12 = (bool)((byte)(uVar64 >> 6) & 1);
        auVar106._24_4_ = (float)((uint)bVar12 * auVar92._24_4_ | (uint)!bVar12 * auVar100._24_4_);
        bVar12 = SUB81(uVar64 >> 7,0);
        auVar106._28_4_ = (uint)bVar12 * auVar92._28_4_ | (uint)!bVar12 * auVar100._28_4_;
        auVar85 = vxorps_avx512vl(auVar154,auVar154);
        auVar101 = vfmadd213ps_avx512vl(auVar103,auVar103,ZEXT1632(auVar85));
        auVar80 = vfmadd231ps_fma(auVar101,auVar104,auVar104);
        auVar100 = vrsqrt14ps_avx512vl(ZEXT1632(auVar80));
        fVar75 = auVar100._0_4_;
        fVar76 = auVar100._4_4_;
        fVar128 = auVar100._8_4_;
        fVar129 = auVar100._12_4_;
        fVar130 = auVar100._16_4_;
        fVar131 = auVar100._20_4_;
        fVar133 = auVar100._24_4_;
        auVar101._4_4_ = fVar76 * fVar76 * fVar76 * auVar80._4_4_ * -0.5;
        auVar101._0_4_ = fVar75 * fVar75 * fVar75 * auVar80._0_4_ * -0.5;
        auVar101._8_4_ = fVar128 * fVar128 * fVar128 * auVar80._8_4_ * -0.5;
        auVar101._12_4_ = fVar129 * fVar129 * fVar129 * auVar80._12_4_ * -0.5;
        auVar101._16_4_ = fVar130 * fVar130 * fVar130 * -0.0;
        auVar101._20_4_ = fVar131 * fVar131 * fVar131 * -0.0;
        auVar101._24_4_ = fVar133 * fVar133 * fVar133 * -0.0;
        auVar101._28_4_ = 0;
        auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar86,auVar100);
        auVar102._4_4_ = auVar104._4_4_ * auVar101._4_4_;
        auVar102._0_4_ = auVar104._0_4_ * auVar101._0_4_;
        auVar102._8_4_ = auVar104._8_4_ * auVar101._8_4_;
        auVar102._12_4_ = auVar104._12_4_ * auVar101._12_4_;
        auVar102._16_4_ = auVar104._16_4_ * auVar101._16_4_;
        auVar102._20_4_ = auVar104._20_4_ * auVar101._20_4_;
        auVar102._24_4_ = auVar104._24_4_ * auVar101._24_4_;
        auVar102._28_4_ = auVar100._28_4_;
        auVar100._4_4_ = auVar101._4_4_ * -auVar103._4_4_;
        auVar100._0_4_ = auVar101._0_4_ * -auVar103._0_4_;
        auVar100._8_4_ = auVar101._8_4_ * -auVar103._8_4_;
        auVar100._12_4_ = auVar101._12_4_ * -auVar103._12_4_;
        auVar100._16_4_ = auVar101._16_4_ * -fVar151;
        auVar100._20_4_ = auVar101._20_4_ * -fVar156;
        auVar100._24_4_ = auVar101._24_4_ * -fVar150;
        auVar100._28_4_ = uVar65 ^ 0x80000000;
        auVar87 = vmulps_avx512vl(auVar101,ZEXT1632(auVar85));
        auVar91 = ZEXT1632(auVar85);
        auVar99 = vfmadd213ps_avx512vl(auVar105,auVar105,auVar91);
        auVar80 = vfmadd231ps_fma(auVar99,auVar106,auVar106);
        auVar98 = vrsqrt14ps_avx512vl(ZEXT1632(auVar80));
        fVar156 = auVar98._0_4_;
        fVar150 = auVar98._4_4_;
        fVar151 = auVar98._8_4_;
        fVar75 = auVar98._12_4_;
        fVar76 = auVar98._16_4_;
        fVar128 = auVar98._20_4_;
        fVar129 = auVar98._24_4_;
        auVar99._4_4_ = fVar150 * fVar150 * fVar150 * auVar80._4_4_ * -0.5;
        auVar99._0_4_ = fVar156 * fVar156 * fVar156 * auVar80._0_4_ * -0.5;
        auVar99._8_4_ = fVar151 * fVar151 * fVar151 * auVar80._8_4_ * -0.5;
        auVar99._12_4_ = fVar75 * fVar75 * fVar75 * auVar80._12_4_ * -0.5;
        auVar99._16_4_ = fVar76 * fVar76 * fVar76 * -0.0;
        auVar99._20_4_ = fVar128 * fVar128 * fVar128 * -0.0;
        auVar99._24_4_ = fVar129 * fVar129 * fVar129 * -0.0;
        auVar99._28_4_ = 0;
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar86,auVar98);
        auVar88._4_4_ = auVar106._4_4_ * auVar99._4_4_;
        auVar88._0_4_ = auVar106._0_4_ * auVar99._0_4_;
        auVar88._8_4_ = auVar106._8_4_ * auVar99._8_4_;
        auVar88._12_4_ = auVar106._12_4_ * auVar99._12_4_;
        auVar88._16_4_ = auVar106._16_4_ * auVar99._16_4_;
        auVar88._20_4_ = auVar106._20_4_ * auVar99._20_4_;
        auVar88._24_4_ = auVar106._24_4_ * auVar99._24_4_;
        auVar88._28_4_ = auVar98._28_4_;
        auVar98._4_4_ = -auVar105._4_4_ * auVar99._4_4_;
        auVar98._0_4_ = -auVar105._0_4_ * auVar99._0_4_;
        auVar98._8_4_ = -auVar105._8_4_ * auVar99._8_4_;
        auVar98._12_4_ = -auVar105._12_4_ * auVar99._12_4_;
        auVar98._16_4_ = -fVar180 * auVar99._16_4_;
        auVar98._20_4_ = -fVar164 * auVar99._20_4_;
        auVar98._24_4_ = -fVar152 * auVar99._24_4_;
        auVar98._28_4_ = auVar101._28_4_;
        auVar101 = vmulps_avx512vl(auVar99,auVar91);
        auVar80 = vfmadd213ps_fma(auVar102,auVar94,auVar89);
        auVar78 = vfmadd213ps_fma(auVar100,auVar94,auVar90);
        auVar99 = vfmadd213ps_avx512vl(auVar87,auVar94,auVar97);
        auVar86 = vfmadd213ps_avx512vl(auVar88,auVar95,ZEXT1632(auVar23));
        auVar77 = vfnmadd213ps_fma(auVar102,auVar94,auVar89);
        auVar84 = vfmadd213ps_fma(auVar98,auVar95,ZEXT1632(auVar82));
        auVar138 = vfnmadd213ps_fma(auVar100,auVar94,auVar90);
        auVar79 = vfmadd213ps_fma(auVar101,auVar95,auVar96);
        auVar102 = vfnmadd231ps_avx512vl(auVar97,auVar94,auVar87);
        auVar83 = vfnmadd213ps_fma(auVar88,auVar95,ZEXT1632(auVar23));
        auVar82 = vfnmadd213ps_fma(auVar98,auVar95,ZEXT1632(auVar82));
        auVar153 = vfnmadd231ps_fma(auVar96,auVar95,auVar101);
        auVar100 = vsubps_avx512vl(auVar86,ZEXT1632(auVar77));
        auVar101 = vsubps_avx(ZEXT1632(auVar84),ZEXT1632(auVar138));
        auVar87 = vsubps_avx512vl(ZEXT1632(auVar79),auVar102);
        auVar88 = vmulps_avx512vl(auVar101,auVar102);
        auVar23 = vfmsub231ps_fma(auVar88,ZEXT1632(auVar138),auVar87);
        auVar89._4_4_ = auVar77._4_4_ * auVar87._4_4_;
        auVar89._0_4_ = auVar77._0_4_ * auVar87._0_4_;
        auVar89._8_4_ = auVar77._8_4_ * auVar87._8_4_;
        auVar89._12_4_ = auVar77._12_4_ * auVar87._12_4_;
        auVar89._16_4_ = auVar87._16_4_ * 0.0;
        auVar89._20_4_ = auVar87._20_4_ * 0.0;
        auVar89._24_4_ = auVar87._24_4_ * 0.0;
        auVar89._28_4_ = auVar87._28_4_;
        auVar87 = vfmsub231ps_avx512vl(auVar89,auVar102,auVar100);
        auVar90._4_4_ = auVar138._4_4_ * auVar100._4_4_;
        auVar90._0_4_ = auVar138._0_4_ * auVar100._0_4_;
        auVar90._8_4_ = auVar138._8_4_ * auVar100._8_4_;
        auVar90._12_4_ = auVar138._12_4_ * auVar100._12_4_;
        auVar90._16_4_ = auVar100._16_4_ * 0.0;
        auVar90._20_4_ = auVar100._20_4_ * 0.0;
        auVar90._24_4_ = auVar100._24_4_ * 0.0;
        auVar90._28_4_ = auVar100._28_4_;
        auVar81 = vfmsub231ps_fma(auVar90,ZEXT1632(auVar77),auVar101);
        auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar91,auVar87);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar91,ZEXT1632(auVar23));
        auVar96 = ZEXT1632(auVar85);
        uVar64 = vcmpps_avx512vl(auVar101,auVar96,2);
        bVar63 = (byte)uVar64;
        fVar75 = (float)((uint)(bVar63 & 1) * auVar80._0_4_ |
                        (uint)!(bool)(bVar63 & 1) * auVar83._0_4_);
        bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
        fVar128 = (float)((uint)bVar12 * auVar80._4_4_ | (uint)!bVar12 * auVar83._4_4_);
        bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
        fVar130 = (float)((uint)bVar12 * auVar80._8_4_ | (uint)!bVar12 * auVar83._8_4_);
        bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
        fVar133 = (float)((uint)bVar12 * auVar80._12_4_ | (uint)!bVar12 * auVar83._12_4_);
        auVar88 = ZEXT1632(CONCAT412(fVar133,CONCAT48(fVar130,CONCAT44(fVar128,fVar75))));
        fVar76 = (float)((uint)(bVar63 & 1) * auVar78._0_4_ |
                        (uint)!(bool)(bVar63 & 1) * auVar82._0_4_);
        bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
        fVar129 = (float)((uint)bVar12 * auVar78._4_4_ | (uint)!bVar12 * auVar82._4_4_);
        bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
        fVar131 = (float)((uint)bVar12 * auVar78._8_4_ | (uint)!bVar12 * auVar82._8_4_);
        bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
        fVar134 = (float)((uint)bVar12 * auVar78._12_4_ | (uint)!bVar12 * auVar82._12_4_);
        auVar98 = ZEXT1632(CONCAT412(fVar134,CONCAT48(fVar131,CONCAT44(fVar129,fVar76))));
        auVar107._0_4_ =
             (float)((uint)(bVar63 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar153._0_4_
                    );
        bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar107._4_4_ = (float)((uint)bVar12 * auVar99._4_4_ | (uint)!bVar12 * auVar153._4_4_);
        bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar107._8_4_ = (float)((uint)bVar12 * auVar99._8_4_ | (uint)!bVar12 * auVar153._8_4_);
        bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar107._12_4_ = (float)((uint)bVar12 * auVar99._12_4_ | (uint)!bVar12 * auVar153._12_4_);
        fVar151 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar99._16_4_);
        auVar107._16_4_ = fVar151;
        fVar150 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar99._20_4_);
        auVar107._20_4_ = fVar150;
        fVar156 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar99._24_4_);
        auVar107._24_4_ = fVar156;
        iVar1 = (uint)(byte)(uVar64 >> 7) * auVar99._28_4_;
        auVar107._28_4_ = iVar1;
        auVar100 = vblendmps_avx512vl(ZEXT1632(auVar77),auVar86);
        auVar108._0_4_ =
             (uint)(bVar63 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar23._0_4_;
        bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar108._4_4_ = (uint)bVar12 * auVar100._4_4_ | (uint)!bVar12 * auVar23._4_4_;
        bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar108._8_4_ = (uint)bVar12 * auVar100._8_4_ | (uint)!bVar12 * auVar23._8_4_;
        bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar108._12_4_ = (uint)bVar12 * auVar100._12_4_ | (uint)!bVar12 * auVar23._12_4_;
        auVar108._16_4_ = (uint)((byte)(uVar64 >> 4) & 1) * auVar100._16_4_;
        auVar108._20_4_ = (uint)((byte)(uVar64 >> 5) & 1) * auVar100._20_4_;
        auVar108._24_4_ = (uint)((byte)(uVar64 >> 6) & 1) * auVar100._24_4_;
        auVar108._28_4_ = (uint)(byte)(uVar64 >> 7) * auVar100._28_4_;
        auVar100 = vblendmps_avx512vl(ZEXT1632(auVar138),ZEXT1632(auVar84));
        auVar109._0_4_ =
             (float)((uint)(bVar63 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar78._0_4_
                    );
        bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar109._4_4_ = (float)((uint)bVar12 * auVar100._4_4_ | (uint)!bVar12 * auVar78._4_4_);
        bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar109._8_4_ = (float)((uint)bVar12 * auVar100._8_4_ | (uint)!bVar12 * auVar78._8_4_);
        bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar109._12_4_ = (float)((uint)bVar12 * auVar100._12_4_ | (uint)!bVar12 * auVar78._12_4_);
        fVar164 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar100._16_4_);
        auVar109._16_4_ = fVar164;
        fVar152 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar100._20_4_);
        auVar109._20_4_ = fVar152;
        fVar180 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar100._24_4_);
        auVar109._24_4_ = fVar180;
        auVar109._28_4_ = (uint)(byte)(uVar64 >> 7) * auVar100._28_4_;
        auVar100 = vblendmps_avx512vl(auVar102,ZEXT1632(auVar79));
        auVar110._0_4_ =
             (float)((uint)(bVar63 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar99._0_4_
                    );
        bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar12 * auVar100._4_4_ | (uint)!bVar12 * auVar99._4_4_);
        bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar12 * auVar100._8_4_ | (uint)!bVar12 * auVar99._8_4_);
        bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar12 * auVar100._12_4_ | (uint)!bVar12 * auVar99._12_4_);
        bVar12 = (bool)((byte)(uVar64 >> 4) & 1);
        auVar110._16_4_ = (float)((uint)bVar12 * auVar100._16_4_ | (uint)!bVar12 * auVar99._16_4_);
        bVar12 = (bool)((byte)(uVar64 >> 5) & 1);
        auVar110._20_4_ = (float)((uint)bVar12 * auVar100._20_4_ | (uint)!bVar12 * auVar99._20_4_);
        bVar12 = (bool)((byte)(uVar64 >> 6) & 1);
        auVar110._24_4_ = (float)((uint)bVar12 * auVar100._24_4_ | (uint)!bVar12 * auVar99._24_4_);
        bVar12 = SUB81(uVar64 >> 7,0);
        auVar110._28_4_ = (uint)bVar12 * auVar100._28_4_ | (uint)!bVar12 * auVar99._28_4_;
        auVar111._0_4_ =
             (uint)(bVar63 & 1) * (int)auVar77._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar86._0_4_;
        bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar111._4_4_ = (uint)bVar12 * (int)auVar77._4_4_ | (uint)!bVar12 * auVar86._4_4_;
        bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar111._8_4_ = (uint)bVar12 * (int)auVar77._8_4_ | (uint)!bVar12 * auVar86._8_4_;
        bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar111._12_4_ = (uint)bVar12 * (int)auVar77._12_4_ | (uint)!bVar12 * auVar86._12_4_;
        auVar111._16_4_ = (uint)!(bool)((byte)(uVar64 >> 4) & 1) * auVar86._16_4_;
        auVar111._20_4_ = (uint)!(bool)((byte)(uVar64 >> 5) & 1) * auVar86._20_4_;
        auVar111._24_4_ = (uint)!(bool)((byte)(uVar64 >> 6) & 1) * auVar86._24_4_;
        auVar111._28_4_ = (uint)!SUB81(uVar64 >> 7,0) * auVar86._28_4_;
        bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
        bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar112._0_4_ =
             (uint)(bVar63 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar79._0_4_;
        bVar13 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar112._4_4_ = (uint)bVar13 * auVar102._4_4_ | (uint)!bVar13 * auVar79._4_4_;
        bVar13 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar112._8_4_ = (uint)bVar13 * auVar102._8_4_ | (uint)!bVar13 * auVar79._8_4_;
        bVar13 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar112._12_4_ = (uint)bVar13 * auVar102._12_4_ | (uint)!bVar13 * auVar79._12_4_;
        auVar112._16_4_ = (uint)((byte)(uVar64 >> 4) & 1) * auVar102._16_4_;
        auVar112._20_4_ = (uint)((byte)(uVar64 >> 5) & 1) * auVar102._20_4_;
        auVar112._24_4_ = (uint)((byte)(uVar64 >> 6) & 1) * auVar102._24_4_;
        iVar2 = (uint)(byte)(uVar64 >> 7) * auVar102._28_4_;
        auVar112._28_4_ = iVar2;
        auVar89 = vsubps_avx512vl(auVar111,auVar88);
        auVar102 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar138._12_4_ |
                                                 (uint)!bVar15 * auVar84._12_4_,
                                                 CONCAT48((uint)bVar14 * (int)auVar138._8_4_ |
                                                          (uint)!bVar14 * auVar84._8_4_,
                                                          CONCAT44((uint)bVar12 *
                                                                   (int)auVar138._4_4_ |
                                                                   (uint)!bVar12 * auVar84._4_4_,
                                                                   (uint)(bVar63 & 1) *
                                                                   (int)auVar138._0_4_ |
                                                                   (uint)!(bool)(bVar63 & 1) *
                                                                   auVar84._0_4_)))),auVar98);
        auVar193 = ZEXT3264(auVar102);
        auVar100 = vsubps_avx(auVar112,auVar107);
        auVar99 = vsubps_avx(auVar88,auVar108);
        auVar199 = ZEXT3264(auVar99);
        auVar86 = vsubps_avx(auVar98,auVar109);
        auVar87 = vsubps_avx(auVar107,auVar110);
        auVar91._4_4_ = auVar100._4_4_ * fVar128;
        auVar91._0_4_ = auVar100._0_4_ * fVar75;
        auVar91._8_4_ = auVar100._8_4_ * fVar130;
        auVar91._12_4_ = auVar100._12_4_ * fVar133;
        auVar91._16_4_ = auVar100._16_4_ * 0.0;
        auVar91._20_4_ = auVar100._20_4_ * 0.0;
        auVar91._24_4_ = auVar100._24_4_ * 0.0;
        auVar91._28_4_ = iVar2;
        auVar80 = vfmsub231ps_fma(auVar91,auVar107,auVar89);
        auVar92._4_4_ = fVar129 * auVar89._4_4_;
        auVar92._0_4_ = fVar76 * auVar89._0_4_;
        auVar92._8_4_ = fVar131 * auVar89._8_4_;
        auVar92._12_4_ = fVar134 * auVar89._12_4_;
        auVar92._16_4_ = auVar89._16_4_ * 0.0;
        auVar92._20_4_ = auVar89._20_4_ * 0.0;
        auVar92._24_4_ = auVar89._24_4_ * 0.0;
        auVar92._28_4_ = auVar101._28_4_;
        auVar78 = vfmsub231ps_fma(auVar92,auVar88,auVar102);
        auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar78),auVar96,ZEXT1632(auVar80));
        auVar183._0_4_ = auVar102._0_4_ * auVar107._0_4_;
        auVar183._4_4_ = auVar102._4_4_ * auVar107._4_4_;
        auVar183._8_4_ = auVar102._8_4_ * auVar107._8_4_;
        auVar183._12_4_ = auVar102._12_4_ * auVar107._12_4_;
        auVar183._16_4_ = auVar102._16_4_ * fVar151;
        auVar183._20_4_ = auVar102._20_4_ * fVar150;
        auVar183._24_4_ = auVar102._24_4_ * fVar156;
        auVar183._28_4_ = 0;
        auVar80 = vfmsub231ps_fma(auVar183,auVar98,auVar100);
        auVar90 = vfmadd231ps_avx512vl(auVar101,auVar96,ZEXT1632(auVar80));
        auVar101 = vmulps_avx512vl(auVar87,auVar108);
        auVar101 = vfmsub231ps_avx512vl(auVar101,auVar99,auVar110);
        auVar97._4_4_ = auVar86._4_4_ * auVar110._4_4_;
        auVar97._0_4_ = auVar86._0_4_ * auVar110._0_4_;
        auVar97._8_4_ = auVar86._8_4_ * auVar110._8_4_;
        auVar97._12_4_ = auVar86._12_4_ * auVar110._12_4_;
        auVar97._16_4_ = auVar86._16_4_ * auVar110._16_4_;
        auVar97._20_4_ = auVar86._20_4_ * auVar110._20_4_;
        auVar97._24_4_ = auVar86._24_4_ * auVar110._24_4_;
        auVar97._28_4_ = auVar110._28_4_;
        auVar80 = vfmsub231ps_fma(auVar97,auVar109,auVar87);
        auVar184._0_4_ = auVar109._0_4_ * auVar99._0_4_;
        auVar184._4_4_ = auVar109._4_4_ * auVar99._4_4_;
        auVar184._8_4_ = auVar109._8_4_ * auVar99._8_4_;
        auVar184._12_4_ = auVar109._12_4_ * auVar99._12_4_;
        auVar184._16_4_ = fVar164 * auVar99._16_4_;
        auVar184._20_4_ = fVar152 * auVar99._20_4_;
        auVar184._24_4_ = fVar180 * auVar99._24_4_;
        auVar184._28_4_ = 0;
        auVar78 = vfmsub231ps_fma(auVar184,auVar86,auVar108);
        auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar78),auVar96,auVar101);
        auVar91 = vfmadd231ps_avx512vl(auVar101,auVar96,ZEXT1632(auVar80));
        auVar187 = ZEXT3264(auVar91);
        auVar101 = vmaxps_avx(auVar90,auVar91);
        uVar25 = vcmpps_avx512vl(auVar101,auVar96,2);
        bVar73 = bVar73 & (byte)uVar25;
        if (bVar73 != 0) {
          uVar137 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar213._4_4_ = uVar137;
          auVar213._0_4_ = uVar137;
          auVar213._8_4_ = uVar137;
          auVar213._12_4_ = uVar137;
          auVar213._16_4_ = uVar137;
          auVar213._20_4_ = uVar137;
          auVar213._24_4_ = uVar137;
          auVar213._28_4_ = uVar137;
          auVar216 = ZEXT3264(auVar213);
          auVar33._4_4_ = auVar87._4_4_ * auVar102._4_4_;
          auVar33._0_4_ = auVar87._0_4_ * auVar102._0_4_;
          auVar33._8_4_ = auVar87._8_4_ * auVar102._8_4_;
          auVar33._12_4_ = auVar87._12_4_ * auVar102._12_4_;
          auVar33._16_4_ = auVar87._16_4_ * auVar102._16_4_;
          auVar33._20_4_ = auVar87._20_4_ * auVar102._20_4_;
          auVar33._24_4_ = auVar87._24_4_ * auVar102._24_4_;
          auVar33._28_4_ = auVar101._28_4_;
          auVar23 = vfmsub231ps_fma(auVar33,auVar86,auVar100);
          auVar34._4_4_ = auVar100._4_4_ * auVar99._4_4_;
          auVar34._0_4_ = auVar100._0_4_ * auVar99._0_4_;
          auVar34._8_4_ = auVar100._8_4_ * auVar99._8_4_;
          auVar34._12_4_ = auVar100._12_4_ * auVar99._12_4_;
          auVar34._16_4_ = auVar100._16_4_ * auVar99._16_4_;
          auVar34._20_4_ = auVar100._20_4_ * auVar99._20_4_;
          auVar34._24_4_ = auVar100._24_4_ * auVar99._24_4_;
          auVar34._28_4_ = auVar100._28_4_;
          auVar84 = vfmsub231ps_fma(auVar34,auVar89,auVar87);
          auVar35._4_4_ = auVar86._4_4_ * auVar89._4_4_;
          auVar35._0_4_ = auVar86._0_4_ * auVar89._0_4_;
          auVar35._8_4_ = auVar86._8_4_ * auVar89._8_4_;
          auVar35._12_4_ = auVar86._12_4_ * auVar89._12_4_;
          auVar35._16_4_ = auVar86._16_4_ * auVar89._16_4_;
          auVar35._20_4_ = auVar86._20_4_ * auVar89._20_4_;
          auVar35._24_4_ = auVar86._24_4_ * auVar89._24_4_;
          auVar35._28_4_ = auVar86._28_4_;
          auVar79 = vfmsub231ps_fma(auVar35,auVar99,auVar102);
          auVar80 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar84),ZEXT1632(auVar79));
          auVar78 = vfmadd231ps_fma(ZEXT1632(auVar80),ZEXT1632(auVar23),ZEXT1232(ZEXT412(0)) << 0x20
                                   );
          auVar101 = vrcp14ps_avx512vl(ZEXT1632(auVar78));
          auVar199 = ZEXT3264(auVar101);
          auVar29._8_4_ = 0x3f800000;
          auVar29._0_8_ = 0x3f8000003f800000;
          auVar29._12_4_ = 0x3f800000;
          auVar29._16_4_ = 0x3f800000;
          auVar29._20_4_ = 0x3f800000;
          auVar29._24_4_ = 0x3f800000;
          auVar29._28_4_ = 0x3f800000;
          auVar102 = vfnmadd213ps_avx512vl(auVar101,ZEXT1632(auVar78),auVar29);
          auVar80 = vfmadd132ps_fma(auVar102,auVar101,auVar101);
          auVar193 = ZEXT1664(auVar80);
          auVar36._4_4_ = auVar79._4_4_ * auVar107._4_4_;
          auVar36._0_4_ = auVar79._0_4_ * auVar107._0_4_;
          auVar36._8_4_ = auVar79._8_4_ * auVar107._8_4_;
          auVar36._12_4_ = auVar79._12_4_ * auVar107._12_4_;
          auVar36._16_4_ = fVar151 * 0.0;
          auVar36._20_4_ = fVar150 * 0.0;
          auVar36._24_4_ = fVar156 * 0.0;
          auVar36._28_4_ = iVar1;
          auVar84 = vfmadd231ps_fma(auVar36,auVar98,ZEXT1632(auVar84));
          auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar88,ZEXT1632(auVar23));
          fVar156 = auVar80._0_4_;
          fVar150 = auVar80._4_4_;
          fVar151 = auVar80._8_4_;
          fVar152 = auVar80._12_4_;
          local_220 = ZEXT1632(CONCAT412(auVar84._12_4_ * fVar152,
                                         CONCAT48(auVar84._8_4_ * fVar151,
                                                  CONCAT44(auVar84._4_4_ * fVar150,
                                                           auVar84._0_4_ * fVar156))));
          auVar206 = ZEXT3264(local_220);
          auVar142._4_4_ = local_420;
          auVar142._0_4_ = local_420;
          auVar142._8_4_ = local_420;
          auVar142._12_4_ = local_420;
          auVar142._16_4_ = local_420;
          auVar142._20_4_ = local_420;
          auVar142._24_4_ = local_420;
          auVar142._28_4_ = local_420;
          uVar25 = vcmpps_avx512vl(local_220,auVar213,2);
          uVar26 = vcmpps_avx512vl(auVar142,local_220,2);
          bVar73 = (byte)uVar25 & (byte)uVar26 & bVar73;
          if (bVar73 != 0) {
            uVar68 = vcmpps_avx512vl(ZEXT1632(auVar78),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar68 = bVar73 & uVar68;
            if ((char)uVar68 != '\0') {
              fVar164 = auVar90._0_4_ * fVar156;
              fVar180 = auVar90._4_4_ * fVar150;
              auVar37._4_4_ = fVar180;
              auVar37._0_4_ = fVar164;
              fVar75 = auVar90._8_4_ * fVar151;
              auVar37._8_4_ = fVar75;
              fVar76 = auVar90._12_4_ * fVar152;
              auVar37._12_4_ = fVar76;
              fVar128 = auVar90._16_4_ * 0.0;
              auVar37._16_4_ = fVar128;
              fVar129 = auVar90._20_4_ * 0.0;
              auVar37._20_4_ = fVar129;
              fVar130 = auVar90._24_4_ * 0.0;
              auVar37._24_4_ = fVar130;
              auVar37._28_4_ = auVar90._28_4_;
              auVar143._8_4_ = 0x3f800000;
              auVar143._0_8_ = 0x3f8000003f800000;
              auVar143._12_4_ = 0x3f800000;
              auVar143._16_4_ = 0x3f800000;
              auVar143._20_4_ = 0x3f800000;
              auVar143._24_4_ = 0x3f800000;
              auVar143._28_4_ = 0x3f800000;
              auVar101 = vsubps_avx(auVar143,auVar37);
              local_260._0_4_ =
                   (float)((uint)(bVar63 & 1) * (int)fVar164 |
                          (uint)!(bool)(bVar63 & 1) * auVar101._0_4_);
              bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
              local_260._4_4_ =
                   (float)((uint)bVar12 * (int)fVar180 | (uint)!bVar12 * auVar101._4_4_);
              bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
              local_260._8_4_ = (float)((uint)bVar12 * (int)fVar75 | (uint)!bVar12 * auVar101._8_4_)
              ;
              bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
              local_260._12_4_ =
                   (float)((uint)bVar12 * (int)fVar76 | (uint)!bVar12 * auVar101._12_4_);
              bVar12 = (bool)((byte)(uVar64 >> 4) & 1);
              local_260._16_4_ =
                   (float)((uint)bVar12 * (int)fVar128 | (uint)!bVar12 * auVar101._16_4_);
              bVar12 = (bool)((byte)(uVar64 >> 5) & 1);
              local_260._20_4_ =
                   (float)((uint)bVar12 * (int)fVar129 | (uint)!bVar12 * auVar101._20_4_);
              bVar12 = (bool)((byte)(uVar64 >> 6) & 1);
              local_260._24_4_ =
                   (float)((uint)bVar12 * (int)fVar130 | (uint)!bVar12 * auVar101._24_4_);
              bVar12 = SUB81(uVar64 >> 7,0);
              local_260._28_4_ =
                   (float)((uint)bVar12 * auVar90._28_4_ | (uint)!bVar12 * auVar101._28_4_);
              auVar101 = vsubps_avx(auVar95,auVar94);
              auVar80 = vfmadd213ps_fma(auVar101,local_260,auVar94);
              uVar137 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x10);
              auVar94._4_4_ = uVar137;
              auVar94._0_4_ = uVar137;
              auVar94._8_4_ = uVar137;
              auVar94._12_4_ = uVar137;
              auVar94._16_4_ = uVar137;
              auVar94._20_4_ = uVar137;
              auVar94._24_4_ = uVar137;
              auVar94._28_4_ = uVar137;
              auVar101 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar80._12_4_ + auVar80._12_4_,
                                                            CONCAT48(auVar80._8_4_ + auVar80._8_4_,
                                                                     CONCAT44(auVar80._4_4_ +
                                                                              auVar80._4_4_,
                                                                              auVar80._0_4_ +
                                                                              auVar80._0_4_)))),
                                         auVar94);
              uVar74 = vcmpps_avx512vl(local_220,auVar101,6);
              uVar68 = uVar68 & uVar74;
              bVar73 = (byte)uVar68;
              if (bVar73 != 0) {
                auVar162._0_4_ = auVar91._0_4_ * fVar156;
                auVar162._4_4_ = auVar91._4_4_ * fVar150;
                auVar162._8_4_ = auVar91._8_4_ * fVar151;
                auVar162._12_4_ = auVar91._12_4_ * fVar152;
                auVar162._16_4_ = auVar91._16_4_ * 0.0;
                auVar162._20_4_ = auVar91._20_4_ * 0.0;
                auVar162._24_4_ = auVar91._24_4_ * 0.0;
                auVar162._28_4_ = 0;
                auVar177._8_4_ = 0x3f800000;
                auVar177._0_8_ = 0x3f8000003f800000;
                auVar177._12_4_ = 0x3f800000;
                auVar177._16_4_ = 0x3f800000;
                auVar177._20_4_ = 0x3f800000;
                auVar177._24_4_ = 0x3f800000;
                auVar177._28_4_ = 0x3f800000;
                auVar101 = vsubps_avx(auVar177,auVar162);
                auVar113._0_4_ =
                     (uint)(bVar63 & 1) * (int)auVar162._0_4_ |
                     (uint)!(bool)(bVar63 & 1) * auVar101._0_4_;
                bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
                auVar113._4_4_ = (uint)bVar12 * (int)auVar162._4_4_ | (uint)!bVar12 * auVar101._4_4_
                ;
                bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
                auVar113._8_4_ = (uint)bVar12 * (int)auVar162._8_4_ | (uint)!bVar12 * auVar101._8_4_
                ;
                bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
                auVar113._12_4_ =
                     (uint)bVar12 * (int)auVar162._12_4_ | (uint)!bVar12 * auVar101._12_4_;
                bVar12 = (bool)((byte)(uVar64 >> 4) & 1);
                auVar113._16_4_ =
                     (uint)bVar12 * (int)auVar162._16_4_ | (uint)!bVar12 * auVar101._16_4_;
                bVar12 = (bool)((byte)(uVar64 >> 5) & 1);
                auVar113._20_4_ =
                     (uint)bVar12 * (int)auVar162._20_4_ | (uint)!bVar12 * auVar101._20_4_;
                bVar12 = (bool)((byte)(uVar64 >> 6) & 1);
                auVar113._24_4_ =
                     (uint)bVar12 * (int)auVar162._24_4_ | (uint)!bVar12 * auVar101._24_4_;
                auVar113._28_4_ = (uint)!SUB81(uVar64 >> 7,0) * auVar101._28_4_;
                auVar95._8_4_ = 0x40000000;
                auVar95._0_8_ = 0x4000000040000000;
                auVar95._12_4_ = 0x40000000;
                auVar95._16_4_ = 0x40000000;
                auVar95._20_4_ = 0x40000000;
                auVar95._24_4_ = 0x40000000;
                auVar95._28_4_ = 0x40000000;
                local_240 = vfmsub132ps_avx512vl(auVar113,auVar177,auVar95);
                local_200 = 0;
                local_1fc = iVar67;
                auVar204 = ZEXT1664(local_5b0);
                local_1f0 = local_5b0;
                local_1e0 = uVar24;
                uStack_1d8 = uVar56;
                local_1d0 = uVar57;
                uStack_1c8 = uVar58;
                local_1c0 = uVar59;
                uStack_1b8 = uVar60;
                if ((pGVar71->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  fVar156 = 1.0 / (float)local_570._0_4_;
                  local_1a0[0] = fVar156 * (local_260._0_4_ + 0.0);
                  local_1a0[1] = fVar156 * (local_260._4_4_ + 1.0);
                  local_1a0[2] = fVar156 * (local_260._8_4_ + 2.0);
                  local_1a0[3] = fVar156 * (local_260._12_4_ + 3.0);
                  fStack_190 = fVar156 * (local_260._16_4_ + 4.0);
                  fStack_18c = fVar156 * (local_260._20_4_ + 5.0);
                  fStack_188 = fVar156 * (local_260._24_4_ + 6.0);
                  fStack_184 = local_260._28_4_ + 7.0;
                  local_180 = local_240;
                  local_160 = local_220;
                  auVar144._8_4_ = 0x7f800000;
                  auVar144._0_8_ = 0x7f8000007f800000;
                  auVar144._12_4_ = 0x7f800000;
                  auVar144._16_4_ = 0x7f800000;
                  auVar144._20_4_ = 0x7f800000;
                  auVar144._24_4_ = 0x7f800000;
                  auVar144._28_4_ = 0x7f800000;
                  auVar101 = vblendmps_avx512vl(auVar144,local_220);
                  auVar114._0_4_ =
                       (uint)(bVar73 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar73 & 1) * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar68 >> 1) & 1);
                  auVar114._4_4_ = (uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar68 >> 2) & 1);
                  auVar114._8_4_ = (uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar68 >> 3) & 1);
                  auVar114._12_4_ = (uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar68 >> 4) & 1);
                  auVar114._16_4_ = (uint)bVar12 * auVar101._16_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar68 >> 5) & 1);
                  auVar114._20_4_ = (uint)bVar12 * auVar101._20_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = (bool)((byte)(uVar68 >> 6) & 1);
                  auVar114._24_4_ = (uint)bVar12 * auVar101._24_4_ | (uint)!bVar12 * 0x7f800000;
                  bVar12 = SUB81(uVar68 >> 7,0);
                  auVar114._28_4_ = (uint)bVar12 * auVar101._28_4_ | (uint)!bVar12 * 0x7f800000;
                  auVar101 = vshufps_avx(auVar114,auVar114,0xb1);
                  auVar101 = vminps_avx(auVar114,auVar101);
                  auVar102 = vshufpd_avx(auVar101,auVar101,5);
                  auVar101 = vminps_avx(auVar101,auVar102);
                  auVar102 = vpermpd_avx2(auVar101,0x4e);
                  auVar101 = vminps_avx(auVar101,auVar102);
                  uVar25 = vcmpps_avx512vl(auVar114,auVar101,0);
                  uVar65 = (uint)uVar68;
                  if (((byte)uVar25 & bVar73) != 0) {
                    uVar65 = (uint)((byte)uVar25 & bVar73);
                  }
                  uVar66 = 0;
                  for (; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x80000000) {
                    uVar66 = uVar66 + 1;
                  }
                  uVar64 = (ulong)uVar66;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar71->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_560 = vpbroadcastd_avx512vl();
                    auVar80 = vpbroadcastd_avx512vl();
                    local_460._0_16_ = auVar80;
                    local_540 = auVar93;
                    local_4e0 = local_220;
                    local_4c0 = pGVar71;
                    do {
                      fVar156 = local_1a0[uVar64];
                      local_3c0._4_4_ = fVar156;
                      local_3c0._0_4_ = fVar156;
                      local_3c0._8_4_ = fVar156;
                      local_3c0._12_4_ = fVar156;
                      local_3b0 = *(undefined4 *)(local_180 + uVar64 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + uVar64 * 4);
                      local_5a0.context = context->user;
                      fVar150 = 1.0 - fVar156;
                      auVar23 = vfnmadd231ss_fma(ZEXT416((uint)(fVar156 * (fVar150 + fVar150))),
                                                 ZEXT416((uint)fVar150),ZEXT416((uint)fVar150));
                      auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_3c0,
                                                ZEXT416(0xc0a00000));
                      auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar156 * fVar156 * 3.0)),
                                                ZEXT416((uint)(fVar156 + fVar156)),auVar80);
                      auVar199 = ZEXT1664(auVar84);
                      auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_3c0,
                                                ZEXT416(0x40000000));
                      auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar150 * fVar150 * -3.0)),
                                                ZEXT416((uint)(fVar150 + fVar150)),auVar80);
                      auVar78 = vfmadd231ss_fma(ZEXT416((uint)(fVar156 * fVar156)),local_3c0,
                                                ZEXT416((uint)(fVar150 * -2.0)));
                      fVar156 = auVar23._0_4_ * 0.5;
                      fVar150 = auVar84._0_4_ * 0.5;
                      fVar151 = auVar80._0_4_ * 0.5;
                      fVar152 = auVar78._0_4_ * 0.5;
                      auVar175._0_4_ = fVar152 * local_5f0;
                      auVar175._4_4_ = fVar152 * fStack_5ec;
                      auVar175._8_4_ = fVar152 * fStack_5e8;
                      auVar175._12_4_ = fVar152 * fStack_5e4;
                      auVar192._4_4_ = fVar151;
                      auVar192._0_4_ = fVar151;
                      auVar192._8_4_ = fVar151;
                      auVar192._12_4_ = fVar151;
                      auVar80 = vfmadd132ps_fma(auVar192,auVar175,auVar139);
                      auVar193 = ZEXT1664(auVar80);
                      auVar176._4_4_ = fVar150;
                      auVar176._0_4_ = fVar150;
                      auVar176._8_4_ = fVar150;
                      auVar176._12_4_ = fVar150;
                      auVar78 = vfmadd132ps_fma(auVar176,auVar80,auVar18);
                      auVar141._4_4_ = fVar156;
                      auVar141._0_4_ = fVar156;
                      auVar141._8_4_ = fVar156;
                      auVar141._12_4_ = fVar156;
                      auVar78 = vfmadd213ps_fma(auVar141,auVar204._0_16_,auVar78);
                      local_3f0 = auVar78._0_4_;
                      local_3e0 = vshufps_avx(auVar78,auVar78,0x55);
                      auVar187 = ZEXT1664(local_3e0);
                      local_3d0 = vshufps_avx(auVar78,auVar78,0xaa);
                      iStack_3ec = local_3f0;
                      iStack_3e8 = local_3f0;
                      iStack_3e4 = local_3f0;
                      uStack_3ac = local_3b0;
                      uStack_3a8 = local_3b0;
                      uStack_3a4 = local_3b0;
                      local_3a0 = local_460._0_8_;
                      uStack_398 = local_460._8_8_;
                      local_390 = local_560;
                      vpcmpeqd_avx2(ZEXT1632(local_560),ZEXT1632(local_560));
                      uStack_37c = (local_5a0.context)->instID[0];
                      local_380 = uStack_37c;
                      uStack_378 = uStack_37c;
                      uStack_374 = uStack_37c;
                      uStack_370 = (local_5a0.context)->instPrimID[0];
                      uStack_36c = uStack_370;
                      uStack_368 = uStack_370;
                      uStack_364 = uStack_370;
                      local_5c0 = local_4f0;
                      local_5a0.valid = (int *)local_5c0;
                      local_5a0.geometryUserPtr = pGVar71->userPtr;
                      local_5a0.hit = (RTCHitN *)&local_3f0;
                      local_5a0.N = 4;
                      local_440 = auVar216._0_32_;
                      local_5a0.ray = (RTCRayN *)ray;
                      if (pGVar71->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar187 = ZEXT1664(local_3e0);
                        auVar193 = ZEXT1664(auVar80);
                        auVar199 = ZEXT1664(auVar84);
                        (*pGVar71->intersectionFilterN)(&local_5a0);
                        auVar206 = ZEXT3264(local_4e0);
                        auVar216 = ZEXT3264(local_440);
                        auVar218 = ZEXT3264(local_540);
                        auVar219 = ZEXT3264(local_4a0);
                        auVar217 = ZEXT3264(local_480);
                        auVar204 = ZEXT1664(local_5b0);
                        pGVar71 = local_4c0;
                      }
                      uVar74 = vptestmd_avx512vl(local_5c0,local_5c0);
                      if ((uVar74 & 0xf) == 0) {
LAB_01ad25b6:
                        *(int *)(ray + k * 4 + 0x80) = auVar216._0_4_;
                      }
                      else {
                        p_Var11 = context->args->filter;
                        if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar71->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar187 = ZEXT1664(auVar187._0_16_);
                          auVar193 = ZEXT1664(auVar193._0_16_);
                          auVar199 = ZEXT1664(auVar199._0_16_);
                          (*p_Var11)(&local_5a0);
                          auVar206 = ZEXT3264(local_4e0);
                          auVar216 = ZEXT3264(local_440);
                          auVar218 = ZEXT3264(local_540);
                          auVar219 = ZEXT3264(local_4a0);
                          auVar217 = ZEXT3264(local_480);
                          auVar204 = ZEXT1664(local_5b0);
                          pGVar71 = local_4c0;
                        }
                        uVar74 = vptestmd_avx512vl(local_5c0,local_5c0);
                        uVar74 = uVar74 & 0xf;
                        bVar73 = (byte)uVar74;
                        if (bVar73 == 0) goto LAB_01ad25b6;
                        iVar1 = *(int *)(local_5a0.hit + 4);
                        iVar2 = *(int *)(local_5a0.hit + 8);
                        iVar55 = *(int *)(local_5a0.hit + 0xc);
                        bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
                        bVar14 = SUB81(uVar74 >> 3,0);
                        *(uint *)(local_5a0.ray + 0xc0) =
                             (uint)(bVar73 & 1) * *(int *)local_5a0.hit |
                             (uint)!(bool)(bVar73 & 1) * *(int *)(local_5a0.ray + 0xc0);
                        *(uint *)(local_5a0.ray + 0xc4) =
                             (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_5a0.ray + 0xc4);
                        *(uint *)(local_5a0.ray + 200) =
                             (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_5a0.ray + 200);
                        *(uint *)(local_5a0.ray + 0xcc) =
                             (uint)bVar14 * iVar55 | (uint)!bVar14 * *(int *)(local_5a0.ray + 0xcc);
                        iVar1 = *(int *)(local_5a0.hit + 0x14);
                        iVar2 = *(int *)(local_5a0.hit + 0x18);
                        iVar55 = *(int *)(local_5a0.hit + 0x1c);
                        bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
                        bVar14 = SUB81(uVar74 >> 3,0);
                        *(uint *)(local_5a0.ray + 0xd0) =
                             (uint)(bVar73 & 1) * *(int *)(local_5a0.hit + 0x10) |
                             (uint)!(bool)(bVar73 & 1) * *(int *)(local_5a0.ray + 0xd0);
                        *(uint *)(local_5a0.ray + 0xd4) =
                             (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_5a0.ray + 0xd4);
                        *(uint *)(local_5a0.ray + 0xd8) =
                             (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_5a0.ray + 0xd8);
                        *(uint *)(local_5a0.ray + 0xdc) =
                             (uint)bVar14 * iVar55 | (uint)!bVar14 * *(int *)(local_5a0.ray + 0xdc);
                        iVar1 = *(int *)(local_5a0.hit + 0x24);
                        iVar2 = *(int *)(local_5a0.hit + 0x28);
                        iVar55 = *(int *)(local_5a0.hit + 0x2c);
                        bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
                        bVar14 = SUB81(uVar74 >> 3,0);
                        *(uint *)(local_5a0.ray + 0xe0) =
                             (uint)(bVar73 & 1) * *(int *)(local_5a0.hit + 0x20) |
                             (uint)!(bool)(bVar73 & 1) * *(int *)(local_5a0.ray + 0xe0);
                        *(uint *)(local_5a0.ray + 0xe4) =
                             (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_5a0.ray + 0xe4);
                        *(uint *)(local_5a0.ray + 0xe8) =
                             (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_5a0.ray + 0xe8);
                        *(uint *)(local_5a0.ray + 0xec) =
                             (uint)bVar14 * iVar55 | (uint)!bVar14 * *(int *)(local_5a0.ray + 0xec);
                        iVar1 = *(int *)(local_5a0.hit + 0x34);
                        iVar2 = *(int *)(local_5a0.hit + 0x38);
                        iVar55 = *(int *)(local_5a0.hit + 0x3c);
                        bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
                        bVar14 = SUB81(uVar74 >> 3,0);
                        *(uint *)(local_5a0.ray + 0xf0) =
                             (uint)(bVar73 & 1) * *(int *)(local_5a0.hit + 0x30) |
                             (uint)!(bool)(bVar73 & 1) * *(int *)(local_5a0.ray + 0xf0);
                        *(uint *)(local_5a0.ray + 0xf4) =
                             (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_5a0.ray + 0xf4);
                        *(uint *)(local_5a0.ray + 0xf8) =
                             (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_5a0.ray + 0xf8);
                        *(uint *)(local_5a0.ray + 0xfc) =
                             (uint)bVar14 * iVar55 | (uint)!bVar14 * *(int *)(local_5a0.ray + 0xfc);
                        iVar1 = *(int *)(local_5a0.hit + 0x44);
                        iVar2 = *(int *)(local_5a0.hit + 0x48);
                        iVar55 = *(int *)(local_5a0.hit + 0x4c);
                        bVar12 = (bool)((byte)(uVar74 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
                        bVar14 = SUB81(uVar74 >> 3,0);
                        *(uint *)(local_5a0.ray + 0x100) =
                             (uint)(bVar73 & 1) * *(int *)(local_5a0.hit + 0x40) |
                             (uint)!(bool)(bVar73 & 1) * *(int *)(local_5a0.ray + 0x100);
                        *(uint *)(local_5a0.ray + 0x104) =
                             (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_5a0.ray + 0x104);
                        *(uint *)(local_5a0.ray + 0x108) =
                             (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_5a0.ray + 0x108);
                        *(uint *)(local_5a0.ray + 0x10c) =
                             (uint)bVar14 * iVar55 | (uint)!bVar14 * *(int *)(local_5a0.ray + 0x10c)
                        ;
                        auVar80 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x50));
                        *(undefined1 (*) [16])(local_5a0.ray + 0x110) = auVar80;
                        auVar80 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x60));
                        *(undefined1 (*) [16])(local_5a0.ray + 0x120) = auVar80;
                        auVar80 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x70));
                        *(undefined1 (*) [16])(local_5a0.ray + 0x130) = auVar80;
                        auVar80 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x80));
                        *(undefined1 (*) [16])(local_5a0.ray + 0x140) = auVar80;
                        auVar216 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                      }
                      auVar93 = auVar218._0_32_;
                      bVar73 = ~(byte)(1 << ((uint)uVar64 & 0x1f)) & (byte)uVar68;
                      uVar137 = auVar216._0_4_;
                      auVar148._4_4_ = uVar137;
                      auVar148._0_4_ = uVar137;
                      auVar148._8_4_ = uVar137;
                      auVar148._12_4_ = uVar137;
                      auVar148._16_4_ = uVar137;
                      auVar148._20_4_ = uVar137;
                      auVar148._24_4_ = uVar137;
                      auVar148._28_4_ = uVar137;
                      uVar25 = vcmpps_avx512vl(auVar206._0_32_,auVar148,2);
                      if ((bVar73 & (byte)uVar25) == 0) goto LAB_01ad140f;
                      bVar73 = bVar73 & (byte)uVar25;
                      uVar68 = (ulong)bVar73;
                      auVar149._8_4_ = 0x7f800000;
                      auVar149._0_8_ = 0x7f8000007f800000;
                      auVar149._12_4_ = 0x7f800000;
                      auVar149._16_4_ = 0x7f800000;
                      auVar149._20_4_ = 0x7f800000;
                      auVar149._24_4_ = 0x7f800000;
                      auVar149._28_4_ = 0x7f800000;
                      auVar101 = vblendmps_avx512vl(auVar149,auVar206._0_32_);
                      auVar127._0_4_ =
                           (uint)(bVar73 & 1) * auVar101._0_4_ |
                           (uint)!(bool)(bVar73 & 1) * 0x7f800000;
                      bVar12 = (bool)(bVar73 >> 1 & 1);
                      auVar127._4_4_ = (uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * 0x7f800000;
                      bVar12 = (bool)(bVar73 >> 2 & 1);
                      auVar127._8_4_ = (uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * 0x7f800000;
                      bVar12 = (bool)(bVar73 >> 3 & 1);
                      auVar127._12_4_ = (uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * 0x7f800000;
                      bVar12 = (bool)(bVar73 >> 4 & 1);
                      auVar127._16_4_ = (uint)bVar12 * auVar101._16_4_ | (uint)!bVar12 * 0x7f800000;
                      bVar12 = (bool)(bVar73 >> 5 & 1);
                      auVar127._20_4_ = (uint)bVar12 * auVar101._20_4_ | (uint)!bVar12 * 0x7f800000;
                      bVar12 = (bool)(bVar73 >> 6 & 1);
                      auVar127._24_4_ = (uint)bVar12 * auVar101._24_4_ | (uint)!bVar12 * 0x7f800000;
                      auVar127._28_4_ =
                           (uint)(bVar73 >> 7) * auVar101._28_4_ |
                           (uint)!(bool)(bVar73 >> 7) * 0x7f800000;
                      auVar101 = vshufps_avx(auVar127,auVar127,0xb1);
                      auVar101 = vminps_avx(auVar127,auVar101);
                      auVar102 = vshufpd_avx(auVar101,auVar101,5);
                      auVar101 = vminps_avx(auVar101,auVar102);
                      auVar102 = vpermpd_avx2(auVar101,0x4e);
                      auVar101 = vminps_avx(auVar101,auVar102);
                      uVar25 = vcmpps_avx512vl(auVar127,auVar101,0);
                      bVar63 = (byte)uVar25 & bVar73;
                      if (bVar63 != 0) {
                        bVar73 = bVar63;
                      }
                      uVar65 = 0;
                      for (uVar66 = (uint)bVar73; (uVar66 & 1) == 0;
                          uVar66 = uVar66 >> 1 | 0x80000000) {
                        uVar65 = uVar65 + 1;
                      }
                      uVar64 = (ulong)uVar65;
                    } while( true );
                  }
                  fVar156 = local_1a0[uVar64];
                  uVar137 = *(undefined4 *)(local_180 + uVar64 * 4);
                  fVar150 = 1.0 - fVar156;
                  auVar18 = vfnmadd231ss_fma(ZEXT416((uint)(fVar156 * (fVar150 + fVar150))),
                                             ZEXT416((uint)fVar150),ZEXT416((uint)fVar150));
                  auVar139 = ZEXT416((uint)fVar156);
                  auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar139,
                                            ZEXT416(0xc0a00000));
                  auVar78 = vfmadd231ss_fma(ZEXT416((uint)(fVar156 * fVar156 * 3.0)),
                                            ZEXT416((uint)(fVar156 + fVar156)),auVar80);
                  auVar199 = ZEXT1664(auVar78);
                  auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar139,
                                            ZEXT416(0x40000000));
                  auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar150 * fVar150 * -3.0)),
                                            ZEXT416((uint)(fVar150 + fVar150)),auVar80);
                  auVar139 = vfmadd231ss_fma(ZEXT416((uint)(fVar156 * fVar156)),auVar139,
                                             ZEXT416((uint)(fVar150 * -2.0)));
                  fVar150 = auVar18._0_4_ * 0.5;
                  fVar151 = auVar78._0_4_ * 0.5;
                  auVar187 = ZEXT464((uint)fVar151);
                  fVar152 = auVar80._0_4_ * 0.5;
                  fVar164 = auVar139._0_4_ * 0.5;
                  auVar169._0_4_ = fVar164 * local_5f0;
                  auVar169._4_4_ = fVar164 * fStack_5ec;
                  auVar169._8_4_ = fVar164 * fStack_5e8;
                  auVar169._12_4_ = fVar164 * fStack_5e4;
                  auVar189._4_4_ = fVar152;
                  auVar189._0_4_ = fVar152;
                  auVar189._8_4_ = fVar152;
                  auVar189._12_4_ = fVar152;
                  auVar80 = vfmadd132ps_fma(auVar189,auVar169,*pauVar4);
                  auVar193 = ZEXT1664(auVar80);
                  auVar170._4_4_ = fVar151;
                  auVar170._0_4_ = fVar151;
                  auVar170._8_4_ = fVar151;
                  auVar170._12_4_ = fVar151;
                  auVar80 = vfmadd132ps_fma(auVar170,auVar80,*pauVar3);
                  auVar160._4_4_ = fVar150;
                  auVar160._0_4_ = fVar150;
                  auVar160._8_4_ = fVar150;
                  auVar160._12_4_ = fVar150;
                  auVar80 = vfmadd213ps_fma(auVar160,local_5b0,auVar80);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + uVar64 * 4);
                  *(int *)(ray + k * 4 + 0xc0) = auVar80._0_4_;
                  uVar10 = vextractps_avx(auVar80,1);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar10;
                  uVar10 = vextractps_avx(auVar80,2);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar10;
                  *(float *)(ray + k * 4 + 0xf0) = fVar156;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar137;
                  *(uint *)(ray + k * 4 + 0x110) = uVar9;
                  *(uint *)(ray + k * 4 + 0x120) = uVar69;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
              }
            }
          }
        }
      }
LAB_01ad140f:
      if (8 < iVar67) {
        auVar101 = vpbroadcastd_avx512vl();
        auVar218 = ZEXT3264(auVar101);
        local_440._4_4_ = local_520._0_4_;
        local_440._0_4_ = local_520._0_4_;
        local_440._8_4_ = local_520._0_4_;
        local_440._12_4_ = local_520._0_4_;
        local_440._16_4_ = local_520._0_4_;
        local_440._20_4_ = local_520._0_4_;
        local_440._24_4_ = local_520._0_4_;
        local_440._28_4_ = local_520._0_4_;
        uStack_41c = local_420;
        uStack_418 = local_420;
        uStack_414 = local_420;
        uStack_410 = local_420;
        uStack_40c = local_420;
        uStack_408 = local_420;
        uStack_404 = local_420;
        fStack_4b8 = 1.0 / (float)local_570._0_4_;
        local_570 = vpbroadcastd_avx512vl();
        local_560 = vpbroadcastd_avx512vl();
        lVar70 = 8;
        local_540 = auVar93;
        fStack_4b4 = fStack_4b8;
        fStack_4b0 = fStack_4b8;
        fStack_4ac = fStack_4b8;
        fStack_4a8 = fStack_4b8;
        fStack_4a4 = fStack_4b8;
        local_4c0._0_4_ = fStack_4b8;
        local_4c0._4_4_ = fStack_4b8;
LAB_01ad14b9:
        auVar101 = vpbroadcastd_avx512vl();
        auVar101 = vpor_avx2(auVar101,_DAT_01fe9900);
        uVar26 = vpcmpgtd_avx512vl(auVar218._0_32_,auVar101);
        auVar101 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar70 * 4 + lVar27);
        auVar102 = *(undefined1 (*) [32])(lVar27 + 0x21b37f0 + lVar70 * 4);
        auVar100 = *(undefined1 (*) [32])(lVar27 + 0x21b3c74 + lVar70 * 4);
        auVar99 = *(undefined1 (*) [32])(lVar27 + 0x21b40f8 + lVar70 * 4);
        auVar206._0_4_ = auVar99._0_4_ * (float)local_340._0_4_;
        auVar206._4_4_ = auVar99._4_4_ * (float)local_340._4_4_;
        auVar206._8_4_ = auVar99._8_4_ * fStack_338;
        auVar206._12_4_ = auVar99._12_4_ * fStack_334;
        auVar206._16_4_ = auVar99._16_4_ * fStack_330;
        auVar206._20_4_ = auVar99._20_4_ * fStack_32c;
        auVar206._28_36_ = auVar193._28_36_;
        auVar206._24_4_ = auVar99._24_4_ * fStack_328;
        auVar193._0_4_ = auVar99._0_4_ * (float)local_360._0_4_;
        auVar193._4_4_ = auVar99._4_4_ * (float)local_360._4_4_;
        auVar193._8_4_ = auVar99._8_4_ * fStack_358;
        auVar193._12_4_ = auVar99._12_4_ * fStack_354;
        auVar193._16_4_ = auVar99._16_4_ * fStack_350;
        auVar193._20_4_ = auVar99._20_4_ * fStack_34c;
        auVar193._28_36_ = auVar187._28_36_;
        auVar193._24_4_ = auVar99._24_4_ * fStack_348;
        auVar86 = vmulps_avx512vl(local_e0,auVar99);
        local_480 = auVar217._0_32_;
        auVar87 = vfmadd231ps_avx512vl(auVar206._0_32_,auVar100,local_300);
        auVar88 = vfmadd231ps_avx512vl(auVar193._0_32_,auVar100,local_320);
        auVar86 = vfmadd231ps_avx512vl(auVar86,auVar100,local_c0);
        auVar87 = vfmadd231ps_avx512vl(auVar87,auVar102,local_2c0);
        auVar88 = vfmadd231ps_avx512vl(auVar88,auVar102,local_2e0);
        auVar98 = vfmadd231ps_avx512vl(auVar86,auVar102,local_a0);
        auVar80 = vfmadd231ps_fma(auVar87,auVar101,local_280);
        auVar193 = ZEXT1664(auVar80);
        auVar78 = vfmadd231ps_fma(auVar88,auVar101,local_2a0);
        auVar187 = ZEXT1664(auVar78);
        auVar86 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar70 * 4 + lVar27);
        auVar87 = *(undefined1 (*) [32])(lVar27 + 0x21b5c10 + lVar70 * 4);
        auVar91 = vfmadd231ps_avx512vl(auVar98,auVar101,local_80);
        auVar88 = *(undefined1 (*) [32])(lVar27 + 0x21b6094 + lVar70 * 4);
        auVar98 = *(undefined1 (*) [32])(lVar27 + 0x21b6518 + lVar70 * 4);
        auVar217._0_4_ = auVar98._0_4_ * (float)local_340._0_4_;
        auVar217._4_4_ = auVar98._4_4_ * (float)local_340._4_4_;
        auVar217._8_4_ = auVar98._8_4_ * fStack_338;
        auVar217._12_4_ = auVar98._12_4_ * fStack_334;
        auVar217._16_4_ = auVar98._16_4_ * fStack_330;
        auVar217._20_4_ = auVar98._20_4_ * fStack_32c;
        auVar217._28_36_ = auVar199._28_36_;
        auVar217._24_4_ = auVar98._24_4_ * fStack_328;
        auVar38._4_4_ = auVar98._4_4_ * (float)local_360._4_4_;
        auVar38._0_4_ = auVar98._0_4_ * (float)local_360._0_4_;
        auVar38._8_4_ = auVar98._8_4_ * fStack_358;
        auVar38._12_4_ = auVar98._12_4_ * fStack_354;
        auVar38._16_4_ = auVar98._16_4_ * fStack_350;
        auVar38._20_4_ = auVar98._20_4_ * fStack_34c;
        auVar38._24_4_ = auVar98._24_4_ * fStack_348;
        auVar38._28_4_ = uStack_344;
        auVar89 = vmulps_avx512vl(local_e0,auVar98);
        auVar90 = vfmadd231ps_avx512vl(auVar217._0_32_,auVar88,local_300);
        auVar217 = ZEXT3264(local_480);
        auVar92 = vfmadd231ps_avx512vl(auVar38,auVar88,local_320);
        auVar89 = vfmadd231ps_avx512vl(auVar89,auVar88,local_c0);
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar87,local_2c0);
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar87,local_2e0);
        auVar89 = vfmadd231ps_avx512vl(auVar89,auVar87,local_a0);
        auVar139 = vfmadd231ps_fma(auVar90,auVar86,local_280);
        auVar199 = ZEXT1664(auVar139);
        auVar18 = vfmadd231ps_fma(auVar92,auVar86,local_2a0);
        auVar92 = vfmadd231ps_avx512vl(auVar89,auVar86,local_80);
        auVar93 = vmaxps_avx512vl(auVar91,auVar92);
        auVar89 = vsubps_avx(ZEXT1632(auVar139),ZEXT1632(auVar80));
        auVar90 = vsubps_avx(ZEXT1632(auVar18),ZEXT1632(auVar78));
        auVar94 = vmulps_avx512vl(ZEXT1632(auVar78),auVar89);
        auVar95 = vmulps_avx512vl(ZEXT1632(auVar80),auVar90);
        auVar94 = vsubps_avx512vl(auVar94,auVar95);
        auVar95 = vmulps_avx512vl(auVar90,auVar90);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar89,auVar89);
        auVar93 = vmulps_avx512vl(auVar93,auVar93);
        auVar93 = vmulps_avx512vl(auVar93,auVar95);
        auVar94 = vmulps_avx512vl(auVar94,auVar94);
        uVar25 = vcmpps_avx512vl(auVar94,auVar93,2);
        bVar73 = (byte)uVar26 & (byte)uVar25;
        if (bVar73 != 0) {
          auVar98 = vmulps_avx512vl(local_120,auVar98);
          auVar88 = vfmadd213ps_avx512vl(auVar88,local_540,auVar98);
          local_4a0 = auVar219._0_32_;
          auVar87 = vfmadd213ps_avx512vl(auVar87,local_4a0,auVar88);
          auVar86 = vfmadd213ps_avx512vl(auVar86,local_480,auVar87);
          auVar99 = vmulps_avx512vl(local_120,auVar99);
          auVar100 = vfmadd213ps_avx512vl(auVar100,local_540,auVar99);
          auVar102 = vfmadd213ps_avx512vl(auVar102,local_4a0,auVar100);
          auVar87 = vfmadd213ps_avx512vl(auVar101,local_480,auVar102);
          auVar101 = *(undefined1 (*) [32])(lVar27 + 0x21b457c + lVar70 * 4);
          auVar102 = *(undefined1 (*) [32])(lVar27 + 0x21b4a00 + lVar70 * 4);
          auVar100 = *(undefined1 (*) [32])(lVar27 + 0x21b4e84 + lVar70 * 4);
          auVar99 = *(undefined1 (*) [32])(lVar27 + 0x21b5308 + lVar70 * 4);
          auVar88 = vmulps_avx512vl(_local_340,auVar99);
          auVar98 = vmulps_avx512vl(_local_360,auVar99);
          auVar99 = vmulps_avx512vl(local_120,auVar99);
          auVar88 = vfmadd231ps_avx512vl(auVar88,auVar100,local_300);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar100,local_320);
          auVar84 = vfmadd231ps_fma(auVar99,auVar100,local_540);
          auVar100 = vfmadd231ps_avx512vl(auVar88,auVar102,local_2c0);
          auVar99 = vfmadd231ps_avx512vl(auVar98,auVar102,local_2e0);
          auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),local_4a0,auVar102);
          auVar88 = vfmadd231ps_avx512vl(auVar100,auVar101,local_280);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar101,local_2a0);
          auVar98 = vfmadd231ps_avx512vl(auVar102,local_480,auVar101);
          auVar101 = *(undefined1 (*) [32])(lVar27 + 0x21b699c + lVar70 * 4);
          auVar102 = *(undefined1 (*) [32])(lVar27 + 0x21b72a4 + lVar70 * 4);
          auVar100 = *(undefined1 (*) [32])(lVar27 + 0x21b7728 + lVar70 * 4);
          auVar93 = vmulps_avx512vl(_local_340,auVar100);
          auVar94 = vmulps_avx512vl(_local_360,auVar100);
          auVar100 = vmulps_avx512vl(local_120,auVar100);
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar102,local_300);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar102,local_320);
          auVar100 = vfmadd231ps_avx512vl(auVar100,local_540,auVar102);
          auVar102 = *(undefined1 (*) [32])(lVar27 + 0x21b6e20 + lVar70 * 4);
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar102,local_2c0);
          auVar217 = ZEXT3264(local_480);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar102,local_2e0);
          auVar102 = vfmadd231ps_avx512vl(auVar100,local_4a0,auVar102);
          auVar100 = vfmadd231ps_avx512vl(auVar93,auVar101,local_280);
          auVar93 = vfmadd231ps_avx512vl(auVar94,auVar101,local_2a0);
          auVar102 = vfmadd231ps_avx512vl(auVar102,local_480,auVar101);
          auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar88,auVar94);
          vandps_avx512vl(auVar99,auVar94);
          auVar101 = vmaxps_avx(auVar94,auVar94);
          vandps_avx512vl(auVar98,auVar94);
          auVar101 = vmaxps_avx(auVar101,auVar94);
          uVar64 = vcmpps_avx512vl(auVar101,local_440,1);
          bVar12 = (bool)((byte)uVar64 & 1);
          auVar115._0_4_ = (float)((uint)bVar12 * auVar89._0_4_ | (uint)!bVar12 * auVar88._0_4_);
          bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar115._4_4_ = (float)((uint)bVar12 * auVar89._4_4_ | (uint)!bVar12 * auVar88._4_4_);
          bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar115._8_4_ = (float)((uint)bVar12 * auVar89._8_4_ | (uint)!bVar12 * auVar88._8_4_);
          bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar115._12_4_ = (float)((uint)bVar12 * auVar89._12_4_ | (uint)!bVar12 * auVar88._12_4_);
          bVar12 = (bool)((byte)(uVar64 >> 4) & 1);
          auVar115._16_4_ = (float)((uint)bVar12 * auVar89._16_4_ | (uint)!bVar12 * auVar88._16_4_);
          bVar12 = (bool)((byte)(uVar64 >> 5) & 1);
          auVar115._20_4_ = (float)((uint)bVar12 * auVar89._20_4_ | (uint)!bVar12 * auVar88._20_4_);
          bVar12 = (bool)((byte)(uVar64 >> 6) & 1);
          auVar115._24_4_ = (float)((uint)bVar12 * auVar89._24_4_ | (uint)!bVar12 * auVar88._24_4_);
          bVar12 = SUB81(uVar64 >> 7,0);
          auVar115._28_4_ = (uint)bVar12 * auVar89._28_4_ | (uint)!bVar12 * auVar88._28_4_;
          bVar12 = (bool)((byte)uVar64 & 1);
          auVar116._0_4_ = (float)((uint)bVar12 * auVar90._0_4_ | (uint)!bVar12 * auVar99._0_4_);
          bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar116._4_4_ = (float)((uint)bVar12 * auVar90._4_4_ | (uint)!bVar12 * auVar99._4_4_);
          bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar116._8_4_ = (float)((uint)bVar12 * auVar90._8_4_ | (uint)!bVar12 * auVar99._8_4_);
          bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar116._12_4_ = (float)((uint)bVar12 * auVar90._12_4_ | (uint)!bVar12 * auVar99._12_4_);
          bVar12 = (bool)((byte)(uVar64 >> 4) & 1);
          auVar116._16_4_ = (float)((uint)bVar12 * auVar90._16_4_ | (uint)!bVar12 * auVar99._16_4_);
          bVar12 = (bool)((byte)(uVar64 >> 5) & 1);
          auVar116._20_4_ = (float)((uint)bVar12 * auVar90._20_4_ | (uint)!bVar12 * auVar99._20_4_);
          bVar12 = (bool)((byte)(uVar64 >> 6) & 1);
          auVar116._24_4_ = (float)((uint)bVar12 * auVar90._24_4_ | (uint)!bVar12 * auVar99._24_4_);
          bVar12 = SUB81(uVar64 >> 7,0);
          auVar116._28_4_ = (uint)bVar12 * auVar90._28_4_ | (uint)!bVar12 * auVar99._28_4_;
          vandps_avx512vl(auVar100,auVar94);
          vandps_avx512vl(auVar93,auVar94);
          auVar101 = vmaxps_avx(auVar116,auVar116);
          vandps_avx512vl(auVar102,auVar94);
          auVar101 = vmaxps_avx(auVar101,auVar116);
          uVar64 = vcmpps_avx512vl(auVar101,local_440,1);
          bVar12 = (bool)((byte)uVar64 & 1);
          auVar117._0_4_ = (uint)bVar12 * auVar89._0_4_ | (uint)!bVar12 * auVar100._0_4_;
          bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar117._4_4_ = (uint)bVar12 * auVar89._4_4_ | (uint)!bVar12 * auVar100._4_4_;
          bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar117._8_4_ = (uint)bVar12 * auVar89._8_4_ | (uint)!bVar12 * auVar100._8_4_;
          bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar117._12_4_ = (uint)bVar12 * auVar89._12_4_ | (uint)!bVar12 * auVar100._12_4_;
          bVar12 = (bool)((byte)(uVar64 >> 4) & 1);
          auVar117._16_4_ = (uint)bVar12 * auVar89._16_4_ | (uint)!bVar12 * auVar100._16_4_;
          bVar12 = (bool)((byte)(uVar64 >> 5) & 1);
          auVar117._20_4_ = (uint)bVar12 * auVar89._20_4_ | (uint)!bVar12 * auVar100._20_4_;
          bVar12 = (bool)((byte)(uVar64 >> 6) & 1);
          auVar117._24_4_ = (uint)bVar12 * auVar89._24_4_ | (uint)!bVar12 * auVar100._24_4_;
          bVar12 = SUB81(uVar64 >> 7,0);
          auVar117._28_4_ = (uint)bVar12 * auVar89._28_4_ | (uint)!bVar12 * auVar100._28_4_;
          bVar12 = (bool)((byte)uVar64 & 1);
          auVar118._0_4_ = (float)((uint)bVar12 * auVar90._0_4_ | (uint)!bVar12 * auVar93._0_4_);
          bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar118._4_4_ = (float)((uint)bVar12 * auVar90._4_4_ | (uint)!bVar12 * auVar93._4_4_);
          bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar118._8_4_ = (float)((uint)bVar12 * auVar90._8_4_ | (uint)!bVar12 * auVar93._8_4_);
          bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar118._12_4_ = (float)((uint)bVar12 * auVar90._12_4_ | (uint)!bVar12 * auVar93._12_4_);
          bVar12 = (bool)((byte)(uVar64 >> 4) & 1);
          auVar118._16_4_ = (float)((uint)bVar12 * auVar90._16_4_ | (uint)!bVar12 * auVar93._16_4_);
          bVar12 = (bool)((byte)(uVar64 >> 5) & 1);
          auVar118._20_4_ = (float)((uint)bVar12 * auVar90._20_4_ | (uint)!bVar12 * auVar93._20_4_);
          bVar12 = (bool)((byte)(uVar64 >> 6) & 1);
          auVar118._24_4_ = (float)((uint)bVar12 * auVar90._24_4_ | (uint)!bVar12 * auVar93._24_4_);
          bVar12 = SUB81(uVar64 >> 7,0);
          auVar118._28_4_ = (uint)bVar12 * auVar90._28_4_ | (uint)!bVar12 * auVar93._28_4_;
          auVar203._8_4_ = 0x80000000;
          auVar203._0_8_ = 0x8000000080000000;
          auVar203._12_4_ = 0x80000000;
          auVar203._16_4_ = 0x80000000;
          auVar203._20_4_ = 0x80000000;
          auVar203._24_4_ = 0x80000000;
          auVar203._28_4_ = 0x80000000;
          auVar101 = vxorps_avx512vl(auVar117,auVar203);
          auVar85 = vxorps_avx512vl(auVar94._0_16_,auVar94._0_16_);
          auVar102 = vfmadd213ps_avx512vl(auVar115,auVar115,ZEXT1632(auVar85));
          auVar84 = vfmadd231ps_fma(auVar102,auVar116,auVar116);
          auVar102 = vrsqrt14ps_avx512vl(ZEXT1632(auVar84));
          auVar214._8_4_ = 0xbf000000;
          auVar214._0_8_ = 0xbf000000bf000000;
          auVar214._12_4_ = 0xbf000000;
          auVar214._16_4_ = 0xbf000000;
          auVar214._20_4_ = 0xbf000000;
          auVar214._24_4_ = 0xbf000000;
          auVar214._28_4_ = 0xbf000000;
          fVar156 = auVar102._0_4_;
          fVar150 = auVar102._4_4_;
          fVar151 = auVar102._8_4_;
          fVar152 = auVar102._12_4_;
          fVar164 = auVar102._16_4_;
          fVar180 = auVar102._20_4_;
          fVar75 = auVar102._24_4_;
          auVar39._4_4_ = fVar150 * fVar150 * fVar150 * auVar84._4_4_ * -0.5;
          auVar39._0_4_ = fVar156 * fVar156 * fVar156 * auVar84._0_4_ * -0.5;
          auVar39._8_4_ = fVar151 * fVar151 * fVar151 * auVar84._8_4_ * -0.5;
          auVar39._12_4_ = fVar152 * fVar152 * fVar152 * auVar84._12_4_ * -0.5;
          auVar39._16_4_ = fVar164 * fVar164 * fVar164 * -0.0;
          auVar39._20_4_ = fVar180 * fVar180 * fVar180 * -0.0;
          auVar39._24_4_ = fVar75 * fVar75 * fVar75 * -0.0;
          auVar39._28_4_ = auVar116._28_4_;
          auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar102 = vfmadd231ps_avx512vl(auVar39,auVar100,auVar102);
          auVar40._4_4_ = auVar116._4_4_ * auVar102._4_4_;
          auVar40._0_4_ = auVar116._0_4_ * auVar102._0_4_;
          auVar40._8_4_ = auVar116._8_4_ * auVar102._8_4_;
          auVar40._12_4_ = auVar116._12_4_ * auVar102._12_4_;
          auVar40._16_4_ = auVar116._16_4_ * auVar102._16_4_;
          auVar40._20_4_ = auVar116._20_4_ * auVar102._20_4_;
          auVar40._24_4_ = auVar116._24_4_ * auVar102._24_4_;
          auVar40._28_4_ = 0;
          auVar41._4_4_ = auVar102._4_4_ * -auVar115._4_4_;
          auVar41._0_4_ = auVar102._0_4_ * -auVar115._0_4_;
          auVar41._8_4_ = auVar102._8_4_ * -auVar115._8_4_;
          auVar41._12_4_ = auVar102._12_4_ * -auVar115._12_4_;
          auVar41._16_4_ = auVar102._16_4_ * -auVar115._16_4_;
          auVar41._20_4_ = auVar102._20_4_ * -auVar115._20_4_;
          auVar41._24_4_ = auVar102._24_4_ * -auVar115._24_4_;
          auVar41._28_4_ = auVar116._28_4_;
          auVar99 = vmulps_avx512vl(auVar102,ZEXT1632(auVar85));
          auVar98 = ZEXT1632(auVar85);
          auVar102 = vfmadd213ps_avx512vl(auVar117,auVar117,auVar98);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar118,auVar118);
          auVar88 = vrsqrt14ps_avx512vl(auVar102);
          auVar102 = vmulps_avx512vl(auVar102,auVar214);
          fVar156 = auVar88._0_4_;
          fVar150 = auVar88._4_4_;
          fVar151 = auVar88._8_4_;
          fVar152 = auVar88._12_4_;
          fVar164 = auVar88._16_4_;
          fVar180 = auVar88._20_4_;
          fVar75 = auVar88._24_4_;
          auVar42._4_4_ = fVar150 * fVar150 * fVar150 * auVar102._4_4_;
          auVar42._0_4_ = fVar156 * fVar156 * fVar156 * auVar102._0_4_;
          auVar42._8_4_ = fVar151 * fVar151 * fVar151 * auVar102._8_4_;
          auVar42._12_4_ = fVar152 * fVar152 * fVar152 * auVar102._12_4_;
          auVar42._16_4_ = fVar164 * fVar164 * fVar164 * auVar102._16_4_;
          auVar42._20_4_ = fVar180 * fVar180 * fVar180 * auVar102._20_4_;
          auVar42._24_4_ = fVar75 * fVar75 * fVar75 * auVar102._24_4_;
          auVar42._28_4_ = auVar102._28_4_;
          auVar102 = vfmadd231ps_avx512vl(auVar42,auVar100,auVar88);
          auVar43._4_4_ = auVar118._4_4_ * auVar102._4_4_;
          auVar43._0_4_ = auVar118._0_4_ * auVar102._0_4_;
          auVar43._8_4_ = auVar118._8_4_ * auVar102._8_4_;
          auVar43._12_4_ = auVar118._12_4_ * auVar102._12_4_;
          auVar43._16_4_ = auVar118._16_4_ * auVar102._16_4_;
          auVar43._20_4_ = auVar118._20_4_ * auVar102._20_4_;
          auVar43._24_4_ = auVar118._24_4_ * auVar102._24_4_;
          auVar43._28_4_ = auVar88._28_4_;
          auVar44._4_4_ = auVar102._4_4_ * auVar101._4_4_;
          auVar44._0_4_ = auVar102._0_4_ * auVar101._0_4_;
          auVar44._8_4_ = auVar102._8_4_ * auVar101._8_4_;
          auVar44._12_4_ = auVar102._12_4_ * auVar101._12_4_;
          auVar44._16_4_ = auVar102._16_4_ * auVar101._16_4_;
          auVar44._20_4_ = auVar102._20_4_ * auVar101._20_4_;
          auVar44._24_4_ = auVar102._24_4_ * auVar101._24_4_;
          auVar44._28_4_ = auVar101._28_4_;
          auVar101 = vmulps_avx512vl(auVar102,auVar98);
          auVar84 = vfmadd213ps_fma(auVar40,auVar91,ZEXT1632(auVar80));
          auVar23 = vfmadd213ps_fma(auVar41,auVar91,ZEXT1632(auVar78));
          auVar100 = vfmadd213ps_avx512vl(auVar99,auVar91,auVar87);
          auVar88 = vfmadd213ps_avx512vl(auVar43,auVar92,ZEXT1632(auVar139));
          auVar81 = vfnmadd213ps_fma(auVar40,auVar91,ZEXT1632(auVar80));
          auVar80 = vfmadd213ps_fma(auVar44,auVar92,ZEXT1632(auVar18));
          auVar77 = vfnmadd213ps_fma(auVar41,auVar91,ZEXT1632(auVar78));
          auVar78 = vfmadd213ps_fma(auVar101,auVar92,auVar86);
          auVar83 = vfnmadd231ps_fma(auVar87,auVar91,auVar99);
          auVar138 = vfnmadd213ps_fma(auVar43,auVar92,ZEXT1632(auVar139));
          auVar82 = vfnmadd213ps_fma(auVar44,auVar92,ZEXT1632(auVar18));
          auVar153 = vfnmadd231ps_fma(auVar86,auVar92,auVar101);
          auVar86 = vsubps_avx512vl(auVar88,ZEXT1632(auVar81));
          auVar101 = vsubps_avx(ZEXT1632(auVar80),ZEXT1632(auVar77));
          auVar102 = vsubps_avx(ZEXT1632(auVar78),ZEXT1632(auVar83));
          auVar45._4_4_ = auVar101._4_4_ * auVar83._4_4_;
          auVar45._0_4_ = auVar101._0_4_ * auVar83._0_4_;
          auVar45._8_4_ = auVar101._8_4_ * auVar83._8_4_;
          auVar45._12_4_ = auVar101._12_4_ * auVar83._12_4_;
          auVar45._16_4_ = auVar101._16_4_ * 0.0;
          auVar45._20_4_ = auVar101._20_4_ * 0.0;
          auVar45._24_4_ = auVar101._24_4_ * 0.0;
          auVar45._28_4_ = auVar99._28_4_;
          auVar139 = vfmsub231ps_fma(auVar45,ZEXT1632(auVar77),auVar102);
          auVar46._4_4_ = auVar102._4_4_ * auVar81._4_4_;
          auVar46._0_4_ = auVar102._0_4_ * auVar81._0_4_;
          auVar46._8_4_ = auVar102._8_4_ * auVar81._8_4_;
          auVar46._12_4_ = auVar102._12_4_ * auVar81._12_4_;
          auVar46._16_4_ = auVar102._16_4_ * 0.0;
          auVar46._20_4_ = auVar102._20_4_ * 0.0;
          auVar46._24_4_ = auVar102._24_4_ * 0.0;
          auVar46._28_4_ = auVar102._28_4_;
          auVar18 = vfmsub231ps_fma(auVar46,ZEXT1632(auVar83),auVar86);
          auVar47._4_4_ = auVar77._4_4_ * auVar86._4_4_;
          auVar47._0_4_ = auVar77._0_4_ * auVar86._0_4_;
          auVar47._8_4_ = auVar77._8_4_ * auVar86._8_4_;
          auVar47._12_4_ = auVar77._12_4_ * auVar86._12_4_;
          auVar47._16_4_ = auVar86._16_4_ * 0.0;
          auVar47._20_4_ = auVar86._20_4_ * 0.0;
          auVar47._24_4_ = auVar86._24_4_ * 0.0;
          auVar47._28_4_ = auVar86._28_4_;
          auVar79 = vfmsub231ps_fma(auVar47,ZEXT1632(auVar81),auVar101);
          auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar98,ZEXT1632(auVar18));
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar98,ZEXT1632(auVar139));
          auVar94 = ZEXT1632(auVar85);
          uVar64 = vcmpps_avx512vl(auVar101,auVar94,2);
          bVar63 = (byte)uVar64;
          fVar129 = (float)((uint)(bVar63 & 1) * auVar84._0_4_ |
                           (uint)!(bool)(bVar63 & 1) * auVar138._0_4_);
          bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
          fVar131 = (float)((uint)bVar12 * auVar84._4_4_ | (uint)!bVar12 * auVar138._4_4_);
          bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
          fVar134 = (float)((uint)bVar12 * auVar84._8_4_ | (uint)!bVar12 * auVar138._8_4_);
          bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
          fVar135 = (float)((uint)bVar12 * auVar84._12_4_ | (uint)!bVar12 * auVar138._12_4_);
          auVar98 = ZEXT1632(CONCAT412(fVar135,CONCAT48(fVar134,CONCAT44(fVar131,fVar129))));
          fVar130 = (float)((uint)(bVar63 & 1) * auVar23._0_4_ |
                           (uint)!(bool)(bVar63 & 1) * auVar82._0_4_);
          bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
          fVar133 = (float)((uint)bVar12 * auVar23._4_4_ | (uint)!bVar12 * auVar82._4_4_);
          bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
          fVar132 = (float)((uint)bVar12 * auVar23._8_4_ | (uint)!bVar12 * auVar82._8_4_);
          bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
          fVar136 = (float)((uint)bVar12 * auVar23._12_4_ | (uint)!bVar12 * auVar82._12_4_);
          auVar89 = ZEXT1632(CONCAT412(fVar136,CONCAT48(fVar132,CONCAT44(fVar133,fVar130))));
          auVar119._0_4_ =
               (float)((uint)(bVar63 & 1) * auVar100._0_4_ |
                      (uint)!(bool)(bVar63 & 1) * auVar153._0_4_);
          bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar119._4_4_ = (float)((uint)bVar12 * auVar100._4_4_ | (uint)!bVar12 * auVar153._4_4_);
          bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar119._8_4_ = (float)((uint)bVar12 * auVar100._8_4_ | (uint)!bVar12 * auVar153._8_4_);
          bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar119._12_4_ =
               (float)((uint)bVar12 * auVar100._12_4_ | (uint)!bVar12 * auVar153._12_4_);
          fVar151 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar100._16_4_);
          auVar119._16_4_ = fVar151;
          fVar156 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar100._20_4_);
          auVar119._20_4_ = fVar156;
          fVar150 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar100._24_4_);
          auVar119._24_4_ = fVar150;
          iVar1 = (uint)(byte)(uVar64 >> 7) * auVar100._28_4_;
          auVar119._28_4_ = iVar1;
          auVar101 = vblendmps_avx512vl(ZEXT1632(auVar81),auVar88);
          auVar120._0_4_ =
               (uint)(bVar63 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar139._0_4_;
          bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar120._4_4_ = (uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * auVar139._4_4_;
          bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar120._8_4_ = (uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * auVar139._8_4_;
          bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar120._12_4_ = (uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * auVar139._12_4_;
          auVar120._16_4_ = (uint)((byte)(uVar64 >> 4) & 1) * auVar101._16_4_;
          auVar120._20_4_ = (uint)((byte)(uVar64 >> 5) & 1) * auVar101._20_4_;
          auVar120._24_4_ = (uint)((byte)(uVar64 >> 6) & 1) * auVar101._24_4_;
          auVar120._28_4_ = (uint)(byte)(uVar64 >> 7) * auVar101._28_4_;
          auVar101 = vblendmps_avx512vl(ZEXT1632(auVar77),ZEXT1632(auVar80));
          auVar121._0_4_ =
               (float)((uint)(bVar63 & 1) * auVar101._0_4_ |
                      (uint)!(bool)(bVar63 & 1) * auVar84._0_4_);
          bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar121._4_4_ = (float)((uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * auVar84._4_4_);
          bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar121._8_4_ = (float)((uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * auVar84._8_4_);
          bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar121._12_4_ = (float)((uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * auVar84._12_4_)
          ;
          fVar180 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar101._16_4_);
          auVar121._16_4_ = fVar180;
          fVar152 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar101._20_4_);
          auVar121._20_4_ = fVar152;
          fVar164 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar101._24_4_);
          auVar121._24_4_ = fVar164;
          auVar121._28_4_ = (uint)(byte)(uVar64 >> 7) * auVar101._28_4_;
          auVar101 = vblendmps_avx512vl(ZEXT1632(auVar83),ZEXT1632(auVar78));
          auVar122._0_4_ =
               (float)((uint)(bVar63 & 1) * auVar101._0_4_ |
                      (uint)!(bool)(bVar63 & 1) * auVar23._0_4_);
          bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar122._4_4_ = (float)((uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * auVar23._4_4_);
          bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar122._8_4_ = (float)((uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * auVar23._8_4_);
          bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar122._12_4_ = (float)((uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * auVar23._12_4_)
          ;
          fVar75 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar101._16_4_);
          auVar122._16_4_ = fVar75;
          fVar76 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar101._20_4_);
          auVar122._20_4_ = fVar76;
          fVar128 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar101._24_4_);
          auVar122._24_4_ = fVar128;
          iVar2 = (uint)(byte)(uVar64 >> 7) * auVar101._28_4_;
          auVar122._28_4_ = iVar2;
          auVar123._0_4_ =
               (uint)(bVar63 & 1) * (int)auVar81._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar88._0_4_;
          bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar123._4_4_ = (uint)bVar12 * (int)auVar81._4_4_ | (uint)!bVar12 * auVar88._4_4_;
          bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar123._8_4_ = (uint)bVar12 * (int)auVar81._8_4_ | (uint)!bVar12 * auVar88._8_4_;
          bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar123._12_4_ = (uint)bVar12 * (int)auVar81._12_4_ | (uint)!bVar12 * auVar88._12_4_;
          auVar123._16_4_ = (uint)!(bool)((byte)(uVar64 >> 4) & 1) * auVar88._16_4_;
          auVar123._20_4_ = (uint)!(bool)((byte)(uVar64 >> 5) & 1) * auVar88._20_4_;
          auVar123._24_4_ = (uint)!(bool)((byte)(uVar64 >> 6) & 1) * auVar88._24_4_;
          auVar123._28_4_ = (uint)!SUB81(uVar64 >> 7,0) * auVar88._28_4_;
          bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar64 >> 3) & 1);
          bVar13 = (bool)((byte)(uVar64 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar64 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar88 = vsubps_avx512vl(auVar123,auVar98);
          auVar102 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar77._12_4_ |
                                                   (uint)!bVar16 * auVar80._12_4_,
                                                   CONCAT48((uint)bVar14 * (int)auVar77._8_4_ |
                                                            (uint)!bVar14 * auVar80._8_4_,
                                                            CONCAT44((uint)bVar12 *
                                                                     (int)auVar77._4_4_ |
                                                                     (uint)!bVar12 * auVar80._4_4_,
                                                                     (uint)(bVar63 & 1) *
                                                                     (int)auVar77._0_4_ |
                                                                     (uint)!(bool)(bVar63 & 1) *
                                                                     auVar80._0_4_)))),auVar89);
          auVar193 = ZEXT3264(auVar102);
          auVar100 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar83._12_4_ |
                                                   (uint)!bVar17 * auVar78._12_4_,
                                                   CONCAT48((uint)bVar15 * (int)auVar83._8_4_ |
                                                            (uint)!bVar15 * auVar78._8_4_,
                                                            CONCAT44((uint)bVar13 *
                                                                     (int)auVar83._4_4_ |
                                                                     (uint)!bVar13 * auVar78._4_4_,
                                                                     (uint)(bVar63 & 1) *
                                                                     (int)auVar83._0_4_ |
                                                                     (uint)!(bool)(bVar63 & 1) *
                                                                     auVar78._0_4_)))),auVar119);
          auVar99 = vsubps_avx(auVar98,auVar120);
          auVar199 = ZEXT3264(auVar99);
          auVar86 = vsubps_avx(auVar89,auVar121);
          auVar87 = vsubps_avx(auVar119,auVar122);
          auVar48._4_4_ = auVar100._4_4_ * fVar131;
          auVar48._0_4_ = auVar100._0_4_ * fVar129;
          auVar48._8_4_ = auVar100._8_4_ * fVar134;
          auVar48._12_4_ = auVar100._12_4_ * fVar135;
          auVar48._16_4_ = auVar100._16_4_ * 0.0;
          auVar48._20_4_ = auVar100._20_4_ * 0.0;
          auVar48._24_4_ = auVar100._24_4_ * 0.0;
          auVar48._28_4_ = 0;
          auVar80 = vfmsub231ps_fma(auVar48,auVar119,auVar88);
          auVar178._0_4_ = fVar130 * auVar88._0_4_;
          auVar178._4_4_ = fVar133 * auVar88._4_4_;
          auVar178._8_4_ = fVar132 * auVar88._8_4_;
          auVar178._12_4_ = fVar136 * auVar88._12_4_;
          auVar178._16_4_ = auVar88._16_4_ * 0.0;
          auVar178._20_4_ = auVar88._20_4_ * 0.0;
          auVar178._24_4_ = auVar88._24_4_ * 0.0;
          auVar178._28_4_ = 0;
          auVar78 = vfmsub231ps_fma(auVar178,auVar98,auVar102);
          auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar78),auVar94,ZEXT1632(auVar80));
          auVar185._0_4_ = auVar102._0_4_ * auVar119._0_4_;
          auVar185._4_4_ = auVar102._4_4_ * auVar119._4_4_;
          auVar185._8_4_ = auVar102._8_4_ * auVar119._8_4_;
          auVar185._12_4_ = auVar102._12_4_ * auVar119._12_4_;
          auVar185._16_4_ = auVar102._16_4_ * fVar151;
          auVar185._20_4_ = auVar102._20_4_ * fVar156;
          auVar185._24_4_ = auVar102._24_4_ * fVar150;
          auVar185._28_4_ = 0;
          auVar80 = vfmsub231ps_fma(auVar185,auVar89,auVar100);
          auVar90 = vfmadd231ps_avx512vl(auVar101,auVar94,ZEXT1632(auVar80));
          auVar101 = vmulps_avx512vl(auVar87,auVar120);
          auVar101 = vfmsub231ps_avx512vl(auVar101,auVar99,auVar122);
          auVar49._4_4_ = auVar86._4_4_ * auVar122._4_4_;
          auVar49._0_4_ = auVar86._0_4_ * auVar122._0_4_;
          auVar49._8_4_ = auVar86._8_4_ * auVar122._8_4_;
          auVar49._12_4_ = auVar86._12_4_ * auVar122._12_4_;
          auVar49._16_4_ = auVar86._16_4_ * fVar75;
          auVar49._20_4_ = auVar86._20_4_ * fVar76;
          auVar49._24_4_ = auVar86._24_4_ * fVar128;
          auVar49._28_4_ = iVar2;
          auVar80 = vfmsub231ps_fma(auVar49,auVar121,auVar87);
          auVar186._0_4_ = auVar121._0_4_ * auVar99._0_4_;
          auVar186._4_4_ = auVar121._4_4_ * auVar99._4_4_;
          auVar186._8_4_ = auVar121._8_4_ * auVar99._8_4_;
          auVar186._12_4_ = auVar121._12_4_ * auVar99._12_4_;
          auVar186._16_4_ = fVar180 * auVar99._16_4_;
          auVar186._20_4_ = fVar152 * auVar99._20_4_;
          auVar186._24_4_ = fVar164 * auVar99._24_4_;
          auVar186._28_4_ = 0;
          auVar78 = vfmsub231ps_fma(auVar186,auVar86,auVar120);
          auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar78),auVar94,auVar101);
          auVar93 = vfmadd231ps_avx512vl(auVar101,auVar94,ZEXT1632(auVar80));
          auVar187 = ZEXT3264(auVar93);
          auVar101 = vmaxps_avx(auVar90,auVar93);
          uVar25 = vcmpps_avx512vl(auVar101,auVar94,2);
          bVar73 = bVar73 & (byte)uVar25;
          if (bVar73 != 0) {
            uVar137 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar215._4_4_ = uVar137;
            auVar215._0_4_ = uVar137;
            auVar215._8_4_ = uVar137;
            auVar215._12_4_ = uVar137;
            auVar215._16_4_ = uVar137;
            auVar215._20_4_ = uVar137;
            auVar215._24_4_ = uVar137;
            auVar215._28_4_ = uVar137;
            auVar216 = ZEXT3264(auVar215);
            auVar50._4_4_ = auVar87._4_4_ * auVar102._4_4_;
            auVar50._0_4_ = auVar87._0_4_ * auVar102._0_4_;
            auVar50._8_4_ = auVar87._8_4_ * auVar102._8_4_;
            auVar50._12_4_ = auVar87._12_4_ * auVar102._12_4_;
            auVar50._16_4_ = auVar87._16_4_ * auVar102._16_4_;
            auVar50._20_4_ = auVar87._20_4_ * auVar102._20_4_;
            auVar50._24_4_ = auVar87._24_4_ * auVar102._24_4_;
            auVar50._28_4_ = auVar101._28_4_;
            auVar18 = vfmsub231ps_fma(auVar50,auVar86,auVar100);
            auVar51._4_4_ = auVar100._4_4_ * auVar99._4_4_;
            auVar51._0_4_ = auVar100._0_4_ * auVar99._0_4_;
            auVar51._8_4_ = auVar100._8_4_ * auVar99._8_4_;
            auVar51._12_4_ = auVar100._12_4_ * auVar99._12_4_;
            auVar51._16_4_ = auVar100._16_4_ * auVar99._16_4_;
            auVar51._20_4_ = auVar100._20_4_ * auVar99._20_4_;
            auVar51._24_4_ = auVar100._24_4_ * auVar99._24_4_;
            auVar51._28_4_ = auVar100._28_4_;
            auVar139 = vfmsub231ps_fma(auVar51,auVar88,auVar87);
            auVar52._4_4_ = auVar86._4_4_ * auVar88._4_4_;
            auVar52._0_4_ = auVar86._0_4_ * auVar88._0_4_;
            auVar52._8_4_ = auVar86._8_4_ * auVar88._8_4_;
            auVar52._12_4_ = auVar86._12_4_ * auVar88._12_4_;
            auVar52._16_4_ = auVar86._16_4_ * auVar88._16_4_;
            auVar52._20_4_ = auVar86._20_4_ * auVar88._20_4_;
            auVar52._24_4_ = auVar86._24_4_ * auVar88._24_4_;
            auVar52._28_4_ = auVar86._28_4_;
            auVar84 = vfmsub231ps_fma(auVar52,auVar99,auVar102);
            auVar80 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar139),ZEXT1632(auVar84));
            auVar78 = vfmadd231ps_fma(ZEXT1632(auVar80),ZEXT1632(auVar18),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar101 = vrcp14ps_avx512vl(ZEXT1632(auVar78));
            auVar199 = ZEXT3264(auVar101);
            auVar30._8_4_ = 0x3f800000;
            auVar30._0_8_ = 0x3f8000003f800000;
            auVar30._12_4_ = 0x3f800000;
            auVar30._16_4_ = 0x3f800000;
            auVar30._20_4_ = 0x3f800000;
            auVar30._24_4_ = 0x3f800000;
            auVar30._28_4_ = 0x3f800000;
            auVar102 = vfnmadd213ps_avx512vl(auVar101,ZEXT1632(auVar78),auVar30);
            auVar80 = vfmadd132ps_fma(auVar102,auVar101,auVar101);
            auVar193 = ZEXT1664(auVar80);
            auVar53._4_4_ = auVar84._4_4_ * auVar119._4_4_;
            auVar53._0_4_ = auVar84._0_4_ * auVar119._0_4_;
            auVar53._8_4_ = auVar84._8_4_ * auVar119._8_4_;
            auVar53._12_4_ = auVar84._12_4_ * auVar119._12_4_;
            auVar53._16_4_ = fVar151 * 0.0;
            auVar53._20_4_ = fVar156 * 0.0;
            auVar53._24_4_ = fVar150 * 0.0;
            auVar53._28_4_ = iVar1;
            auVar139 = vfmadd231ps_fma(auVar53,auVar89,ZEXT1632(auVar139));
            auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar98,ZEXT1632(auVar18));
            fVar156 = auVar80._0_4_;
            fVar150 = auVar80._4_4_;
            fVar151 = auVar80._8_4_;
            fVar152 = auVar80._12_4_;
            local_220 = ZEXT1632(CONCAT412(auVar139._12_4_ * fVar152,
                                           CONCAT48(auVar139._8_4_ * fVar151,
                                                    CONCAT44(auVar139._4_4_ * fVar150,
                                                             auVar139._0_4_ * fVar156))));
            auVar206 = ZEXT3264(local_220);
            uVar25 = vcmpps_avx512vl(local_220,auVar215,2);
            auVar62._4_4_ = uStack_41c;
            auVar62._0_4_ = local_420;
            auVar62._8_4_ = uStack_418;
            auVar62._12_4_ = uStack_414;
            auVar62._16_4_ = uStack_410;
            auVar62._20_4_ = uStack_40c;
            auVar62._24_4_ = uStack_408;
            auVar62._28_4_ = uStack_404;
            uVar26 = vcmpps_avx512vl(local_220,auVar62,0xd);
            bVar73 = (byte)uVar25 & (byte)uVar26 & bVar73;
            if (bVar73 != 0) {
              uVar68 = vcmpps_avx512vl(ZEXT1632(auVar78),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar68 = bVar73 & uVar68;
              if ((char)uVar68 != '\0') {
                fVar164 = auVar90._0_4_ * fVar156;
                fVar180 = auVar90._4_4_ * fVar150;
                auVar54._4_4_ = fVar180;
                auVar54._0_4_ = fVar164;
                fVar75 = auVar90._8_4_ * fVar151;
                auVar54._8_4_ = fVar75;
                fVar76 = auVar90._12_4_ * fVar152;
                auVar54._12_4_ = fVar76;
                fVar128 = auVar90._16_4_ * 0.0;
                auVar54._16_4_ = fVar128;
                fVar129 = auVar90._20_4_ * 0.0;
                auVar54._20_4_ = fVar129;
                fVar130 = auVar90._24_4_ * 0.0;
                auVar54._24_4_ = fVar130;
                auVar54._28_4_ = auVar90._28_4_;
                auVar163._8_4_ = 0x3f800000;
                auVar163._0_8_ = 0x3f8000003f800000;
                auVar163._12_4_ = 0x3f800000;
                auVar163._16_4_ = 0x3f800000;
                auVar163._20_4_ = 0x3f800000;
                auVar163._24_4_ = 0x3f800000;
                auVar163._28_4_ = 0x3f800000;
                auVar101 = vsubps_avx(auVar163,auVar54);
                local_260._0_4_ =
                     (float)((uint)(bVar63 & 1) * (int)fVar164 |
                            (uint)!(bool)(bVar63 & 1) * auVar101._0_4_);
                bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
                local_260._4_4_ =
                     (float)((uint)bVar12 * (int)fVar180 | (uint)!bVar12 * auVar101._4_4_);
                bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
                local_260._8_4_ =
                     (float)((uint)bVar12 * (int)fVar75 | (uint)!bVar12 * auVar101._8_4_);
                bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
                local_260._12_4_ =
                     (float)((uint)bVar12 * (int)fVar76 | (uint)!bVar12 * auVar101._12_4_);
                bVar12 = (bool)((byte)(uVar64 >> 4) & 1);
                local_260._16_4_ =
                     (float)((uint)bVar12 * (int)fVar128 | (uint)!bVar12 * auVar101._16_4_);
                bVar12 = (bool)((byte)(uVar64 >> 5) & 1);
                local_260._20_4_ =
                     (float)((uint)bVar12 * (int)fVar129 | (uint)!bVar12 * auVar101._20_4_);
                bVar12 = (bool)((byte)(uVar64 >> 6) & 1);
                local_260._24_4_ =
                     (float)((uint)bVar12 * (int)fVar130 | (uint)!bVar12 * auVar101._24_4_);
                bVar12 = SUB81(uVar64 >> 7,0);
                local_260._28_4_ =
                     (float)((uint)bVar12 * auVar90._28_4_ | (uint)!bVar12 * auVar101._28_4_);
                auVar101 = vsubps_avx(auVar92,auVar91);
                auVar80 = vfmadd213ps_fma(auVar101,local_260,auVar91);
                uVar137 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x10);
                auVar31._4_4_ = uVar137;
                auVar31._0_4_ = uVar137;
                auVar31._8_4_ = uVar137;
                auVar31._12_4_ = uVar137;
                auVar31._16_4_ = uVar137;
                auVar31._20_4_ = uVar137;
                auVar31._24_4_ = uVar137;
                auVar31._28_4_ = uVar137;
                auVar101 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar80._12_4_ + auVar80._12_4_,
                                                              CONCAT48(auVar80._8_4_ + auVar80._8_4_
                                                                       ,CONCAT44(auVar80._4_4_ +
                                                                                 auVar80._4_4_,
                                                                                 auVar80._0_4_ +
                                                                                 auVar80._0_4_)))),
                                           auVar31);
                uVar74 = vcmpps_avx512vl(local_220,auVar101,6);
                uVar68 = uVar68 & uVar74;
                bVar73 = (byte)uVar68;
                if (bVar73 != 0) {
                  auVar155._0_4_ = auVar93._0_4_ * fVar156;
                  auVar155._4_4_ = auVar93._4_4_ * fVar150;
                  auVar155._8_4_ = auVar93._8_4_ * fVar151;
                  auVar155._12_4_ = auVar93._12_4_ * fVar152;
                  auVar155._16_4_ = auVar93._16_4_ * 0.0;
                  auVar155._20_4_ = auVar93._20_4_ * 0.0;
                  auVar155._24_4_ = auVar93._24_4_ * 0.0;
                  auVar155._28_4_ = 0;
                  auVar179._8_4_ = 0x3f800000;
                  auVar179._0_8_ = 0x3f8000003f800000;
                  auVar179._12_4_ = 0x3f800000;
                  auVar179._16_4_ = 0x3f800000;
                  auVar179._20_4_ = 0x3f800000;
                  auVar179._24_4_ = 0x3f800000;
                  auVar179._28_4_ = 0x3f800000;
                  auVar101 = vsubps_avx(auVar179,auVar155);
                  auVar124._0_4_ =
                       (uint)(bVar63 & 1) * (int)auVar155._0_4_ |
                       (uint)!(bool)(bVar63 & 1) * auVar101._0_4_;
                  bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
                  auVar124._4_4_ =
                       (uint)bVar12 * (int)auVar155._4_4_ | (uint)!bVar12 * auVar101._4_4_;
                  bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
                  auVar124._8_4_ =
                       (uint)bVar12 * (int)auVar155._8_4_ | (uint)!bVar12 * auVar101._8_4_;
                  bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
                  auVar124._12_4_ =
                       (uint)bVar12 * (int)auVar155._12_4_ | (uint)!bVar12 * auVar101._12_4_;
                  bVar12 = (bool)((byte)(uVar64 >> 4) & 1);
                  auVar124._16_4_ =
                       (uint)bVar12 * (int)auVar155._16_4_ | (uint)!bVar12 * auVar101._16_4_;
                  bVar12 = (bool)((byte)(uVar64 >> 5) & 1);
                  auVar124._20_4_ =
                       (uint)bVar12 * (int)auVar155._20_4_ | (uint)!bVar12 * auVar101._20_4_;
                  bVar12 = (bool)((byte)(uVar64 >> 6) & 1);
                  auVar124._24_4_ =
                       (uint)bVar12 * (int)auVar155._24_4_ | (uint)!bVar12 * auVar101._24_4_;
                  auVar124._28_4_ = (uint)!SUB81(uVar64 >> 7,0) * auVar101._28_4_;
                  auVar32._8_4_ = 0x40000000;
                  auVar32._0_8_ = 0x4000000040000000;
                  auVar32._12_4_ = 0x40000000;
                  auVar32._16_4_ = 0x40000000;
                  auVar32._20_4_ = 0x40000000;
                  auVar32._24_4_ = 0x40000000;
                  auVar32._28_4_ = 0x40000000;
                  local_240 = vfmsub132ps_avx512vl(auVar124,auVar179,auVar32);
                  local_200 = (int)lVar70;
                  local_1fc = iVar67;
                  auVar204 = ZEXT1664(local_5b0);
                  local_1f0 = local_5b0;
                  local_1e0 = uVar24;
                  uStack_1d8 = uVar56;
                  local_1d0 = uVar57;
                  uStack_1c8 = uVar58;
                  local_1c0 = uVar59;
                  uStack_1b8 = uVar60;
                  pGVar71 = (context->scene->geometries).items[uVar69].ptr;
                  if ((pGVar71->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    auVar80 = vcvtsi2ss_avx512f(auVar85,(int)lVar70);
                    fVar156 = auVar80._0_4_;
                    local_1a0[0] = (fVar156 + local_260._0_4_ + 0.0) * (float)local_4c0;
                    local_1a0[1] = (fVar156 + local_260._4_4_ + 1.0) * local_4c0._4_4_;
                    local_1a0[2] = (fVar156 + local_260._8_4_ + 2.0) * fStack_4b8;
                    local_1a0[3] = (fVar156 + local_260._12_4_ + 3.0) * fStack_4b4;
                    fStack_190 = (fVar156 + local_260._16_4_ + 4.0) * fStack_4b0;
                    fStack_18c = (fVar156 + local_260._20_4_ + 5.0) * fStack_4ac;
                    fStack_188 = (fVar156 + local_260._24_4_ + 6.0) * fStack_4a8;
                    fStack_184 = fVar156 + local_260._28_4_ + 7.0;
                    local_180 = local_240;
                    local_160 = local_220;
                    auVar145._8_4_ = 0x7f800000;
                    auVar145._0_8_ = 0x7f8000007f800000;
                    auVar145._12_4_ = 0x7f800000;
                    auVar145._16_4_ = 0x7f800000;
                    auVar145._20_4_ = 0x7f800000;
                    auVar145._24_4_ = 0x7f800000;
                    auVar145._28_4_ = 0x7f800000;
                    auVar101 = vblendmps_avx512vl(auVar145,local_220);
                    auVar125._0_4_ =
                         (uint)(bVar73 & 1) * auVar101._0_4_ |
                         (uint)!(bool)(bVar73 & 1) * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar68 >> 1) & 1);
                    auVar125._4_4_ = (uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar68 >> 2) & 1);
                    auVar125._8_4_ = (uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar68 >> 3) & 1);
                    auVar125._12_4_ = (uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar68 >> 4) & 1);
                    auVar125._16_4_ = (uint)bVar12 * auVar101._16_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar68 >> 5) & 1);
                    auVar125._20_4_ = (uint)bVar12 * auVar101._20_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar68 >> 6) & 1);
                    auVar125._24_4_ = (uint)bVar12 * auVar101._24_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = SUB81(uVar68 >> 7,0);
                    auVar125._28_4_ = (uint)bVar12 * auVar101._28_4_ | (uint)!bVar12 * 0x7f800000;
                    auVar101 = vshufps_avx(auVar125,auVar125,0xb1);
                    auVar101 = vminps_avx(auVar125,auVar101);
                    auVar102 = vshufpd_avx(auVar101,auVar101,5);
                    auVar101 = vminps_avx(auVar101,auVar102);
                    auVar102 = vpermpd_avx2(auVar101,0x4e);
                    auVar101 = vminps_avx(auVar101,auVar102);
                    uVar25 = vcmpps_avx512vl(auVar125,auVar101,0);
                    uVar65 = (uint)uVar68;
                    if (((byte)uVar25 & bVar73) != 0) {
                      uVar65 = (uint)((byte)uVar25 & bVar73);
                    }
                    uVar66 = 0;
                    for (; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x80000000) {
                      uVar66 = uVar66 + 1;
                    }
                    uVar64 = (ulong)uVar66;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar71->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_100 = vmovdqa64_avx512vl(auVar218._0_32_);
                      local_4e0._0_4_ = iVar67;
                      local_548 = uVar72;
                      local_460 = local_220;
                      do {
                        fVar156 = local_1a0[uVar64];
                        local_3c0._4_4_ = fVar156;
                        local_3c0._0_4_ = fVar156;
                        local_3c0._8_4_ = fVar156;
                        local_3c0._12_4_ = fVar156;
                        local_3b0 = *(undefined4 *)(local_180 + uVar64 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_160 + uVar64 * 4);
                        local_5a0.context = context->user;
                        fVar150 = 1.0 - fVar156;
                        auVar18 = vfnmadd231ss_fma(ZEXT416((uint)(fVar156 * (fVar150 + fVar150))),
                                                   ZEXT416((uint)fVar150),ZEXT416((uint)fVar150));
                        auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_3c0,
                                                  ZEXT416(0xc0a00000));
                        auVar139 = vfmadd231ss_fma(ZEXT416((uint)(fVar156 * fVar156 * 3.0)),
                                                   ZEXT416((uint)(fVar156 + fVar156)),auVar80);
                        auVar199 = ZEXT1664(auVar139);
                        auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_3c0,
                                                  ZEXT416(0x40000000));
                        auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar150 * fVar150 * -3.0)),
                                                  ZEXT416((uint)(fVar150 + fVar150)),auVar80);
                        auVar78 = vfmadd231ss_fma(ZEXT416((uint)(fVar156 * fVar156)),local_3c0,
                                                  ZEXT416((uint)(fVar150 * -2.0)));
                        fVar156 = auVar18._0_4_ * 0.5;
                        fVar150 = auVar139._0_4_ * 0.5;
                        fVar151 = auVar80._0_4_ * 0.5;
                        fVar152 = auVar78._0_4_ * 0.5;
                        auVar173._0_4_ = fVar152 * local_5f0;
                        auVar173._4_4_ = fVar152 * fStack_5ec;
                        auVar173._8_4_ = fVar152 * fStack_5e8;
                        auVar173._12_4_ = fVar152 * fStack_5e4;
                        auVar191._4_4_ = fVar151;
                        auVar191._0_4_ = fVar151;
                        auVar191._8_4_ = fVar151;
                        auVar191._12_4_ = fVar151;
                        auVar80 = vfmadd132ps_fma(auVar191,auVar173,auVar21);
                        auVar193 = ZEXT1664(auVar80);
                        auVar174._4_4_ = fVar150;
                        auVar174._0_4_ = fVar150;
                        auVar174._8_4_ = fVar150;
                        auVar174._12_4_ = fVar150;
                        auVar78 = vfmadd132ps_fma(auVar174,auVar80,auVar22);
                        auVar140._4_4_ = fVar156;
                        auVar140._0_4_ = fVar156;
                        auVar140._8_4_ = fVar156;
                        auVar140._12_4_ = fVar156;
                        auVar78 = vfmadd213ps_fma(auVar140,auVar204._0_16_,auVar78);
                        local_3f0 = auVar78._0_4_;
                        local_3e0 = vshufps_avx(auVar78,auVar78,0x55);
                        auVar187 = ZEXT1664(local_3e0);
                        local_3d0 = vshufps_avx(auVar78,auVar78,0xaa);
                        iStack_3ec = local_3f0;
                        iStack_3e8 = local_3f0;
                        iStack_3e4 = local_3f0;
                        uStack_3ac = local_3b0;
                        uStack_3a8 = local_3b0;
                        uStack_3a4 = local_3b0;
                        local_3a0 = local_560._0_8_;
                        uStack_398 = local_560._8_8_;
                        local_390 = local_570;
                        vpcmpeqd_avx2(ZEXT1632(local_570),ZEXT1632(local_570));
                        uStack_37c = (local_5a0.context)->instID[0];
                        local_380 = uStack_37c;
                        uStack_378 = uStack_37c;
                        uStack_374 = uStack_37c;
                        uStack_370 = (local_5a0.context)->instPrimID[0];
                        uStack_36c = uStack_370;
                        uStack_368 = uStack_370;
                        uStack_364 = uStack_370;
                        local_5c0 = local_4f0;
                        local_5a0.valid = (int *)local_5c0;
                        local_5a0.geometryUserPtr = pGVar71->userPtr;
                        local_5a0.hit = (RTCHitN *)&local_3f0;
                        local_5a0.N = 4;
                        local_520 = auVar216._0_32_;
                        local_5a0.ray = (RTCRayN *)ray;
                        if (pGVar71->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar187 = ZEXT1664(local_3e0);
                          auVar193 = ZEXT1664(auVar80);
                          auVar199 = ZEXT1664(auVar139);
                          (*pGVar71->intersectionFilterN)(&local_5a0);
                          auVar206 = ZEXT3264(local_460);
                          auVar216 = ZEXT3264(local_520);
                          auVar204 = ZEXT1664(local_5b0);
                        }
                        uVar72 = vptestmd_avx512vl(local_5c0,local_5c0);
                        if ((uVar72 & 0xf) == 0) {
LAB_01ad2121:
                          *(int *)(ray + k * 4 + 0x80) = auVar216._0_4_;
                        }
                        else {
                          p_Var11 = context->args->filter;
                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar71->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar187 = ZEXT1664(auVar187._0_16_);
                            auVar193 = ZEXT1664(auVar193._0_16_);
                            auVar199 = ZEXT1664(auVar199._0_16_);
                            (*p_Var11)(&local_5a0);
                            auVar206 = ZEXT3264(local_460);
                            auVar216 = ZEXT3264(local_520);
                            auVar204 = ZEXT1664(local_5b0);
                          }
                          uVar72 = vptestmd_avx512vl(local_5c0,local_5c0);
                          uVar72 = uVar72 & 0xf;
                          bVar73 = (byte)uVar72;
                          if (bVar73 == 0) goto LAB_01ad2121;
                          iVar67 = *(int *)(local_5a0.hit + 4);
                          iVar1 = *(int *)(local_5a0.hit + 8);
                          iVar2 = *(int *)(local_5a0.hit + 0xc);
                          bVar12 = (bool)((byte)(uVar72 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
                          bVar14 = SUB81(uVar72 >> 3,0);
                          *(uint *)(local_5a0.ray + 0xc0) =
                               (uint)(bVar73 & 1) * *(int *)local_5a0.hit |
                               (uint)!(bool)(bVar73 & 1) * *(int *)(local_5a0.ray + 0xc0);
                          *(uint *)(local_5a0.ray + 0xc4) =
                               (uint)bVar12 * iVar67 |
                               (uint)!bVar12 * *(int *)(local_5a0.ray + 0xc4);
                          *(uint *)(local_5a0.ray + 200) =
                               (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_5a0.ray + 200);
                          *(uint *)(local_5a0.ray + 0xcc) =
                               (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_5a0.ray + 0xcc)
                          ;
                          iVar67 = *(int *)(local_5a0.hit + 0x14);
                          iVar1 = *(int *)(local_5a0.hit + 0x18);
                          iVar2 = *(int *)(local_5a0.hit + 0x1c);
                          bVar12 = (bool)((byte)(uVar72 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
                          bVar14 = SUB81(uVar72 >> 3,0);
                          *(uint *)(local_5a0.ray + 0xd0) =
                               (uint)(bVar73 & 1) * *(int *)(local_5a0.hit + 0x10) |
                               (uint)!(bool)(bVar73 & 1) * *(int *)(local_5a0.ray + 0xd0);
                          *(uint *)(local_5a0.ray + 0xd4) =
                               (uint)bVar12 * iVar67 |
                               (uint)!bVar12 * *(int *)(local_5a0.ray + 0xd4);
                          *(uint *)(local_5a0.ray + 0xd8) =
                               (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_5a0.ray + 0xd8)
                          ;
                          *(uint *)(local_5a0.ray + 0xdc) =
                               (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_5a0.ray + 0xdc)
                          ;
                          iVar67 = *(int *)(local_5a0.hit + 0x24);
                          iVar1 = *(int *)(local_5a0.hit + 0x28);
                          iVar2 = *(int *)(local_5a0.hit + 0x2c);
                          bVar12 = (bool)((byte)(uVar72 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
                          bVar14 = SUB81(uVar72 >> 3,0);
                          *(uint *)(local_5a0.ray + 0xe0) =
                               (uint)(bVar73 & 1) * *(int *)(local_5a0.hit + 0x20) |
                               (uint)!(bool)(bVar73 & 1) * *(int *)(local_5a0.ray + 0xe0);
                          *(uint *)(local_5a0.ray + 0xe4) =
                               (uint)bVar12 * iVar67 |
                               (uint)!bVar12 * *(int *)(local_5a0.ray + 0xe4);
                          *(uint *)(local_5a0.ray + 0xe8) =
                               (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_5a0.ray + 0xe8)
                          ;
                          *(uint *)(local_5a0.ray + 0xec) =
                               (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_5a0.ray + 0xec)
                          ;
                          iVar67 = *(int *)(local_5a0.hit + 0x34);
                          iVar1 = *(int *)(local_5a0.hit + 0x38);
                          iVar2 = *(int *)(local_5a0.hit + 0x3c);
                          bVar12 = (bool)((byte)(uVar72 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
                          bVar14 = SUB81(uVar72 >> 3,0);
                          *(uint *)(local_5a0.ray + 0xf0) =
                               (uint)(bVar73 & 1) * *(int *)(local_5a0.hit + 0x30) |
                               (uint)!(bool)(bVar73 & 1) * *(int *)(local_5a0.ray + 0xf0);
                          *(uint *)(local_5a0.ray + 0xf4) =
                               (uint)bVar12 * iVar67 |
                               (uint)!bVar12 * *(int *)(local_5a0.ray + 0xf4);
                          *(uint *)(local_5a0.ray + 0xf8) =
                               (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_5a0.ray + 0xf8)
                          ;
                          *(uint *)(local_5a0.ray + 0xfc) =
                               (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_5a0.ray + 0xfc)
                          ;
                          iVar67 = *(int *)(local_5a0.hit + 0x44);
                          iVar1 = *(int *)(local_5a0.hit + 0x48);
                          iVar2 = *(int *)(local_5a0.hit + 0x4c);
                          bVar12 = (bool)((byte)(uVar72 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
                          bVar14 = SUB81(uVar72 >> 3,0);
                          *(uint *)(local_5a0.ray + 0x100) =
                               (uint)(bVar73 & 1) * *(int *)(local_5a0.hit + 0x40) |
                               (uint)!(bool)(bVar73 & 1) * *(int *)(local_5a0.ray + 0x100);
                          *(uint *)(local_5a0.ray + 0x104) =
                               (uint)bVar12 * iVar67 |
                               (uint)!bVar12 * *(int *)(local_5a0.ray + 0x104);
                          *(uint *)(local_5a0.ray + 0x108) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_5a0.ray + 0x108);
                          *(uint *)(local_5a0.ray + 0x10c) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_5a0.ray + 0x10c);
                          auVar80 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x50))
                          ;
                          *(undefined1 (*) [16])(local_5a0.ray + 0x110) = auVar80;
                          auVar80 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x60))
                          ;
                          *(undefined1 (*) [16])(local_5a0.ray + 0x120) = auVar80;
                          auVar80 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x70))
                          ;
                          *(undefined1 (*) [16])(local_5a0.ray + 0x130) = auVar80;
                          auVar80 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x80))
                          ;
                          *(undefined1 (*) [16])(local_5a0.ray + 0x140) = auVar80;
                          auVar216 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                        }
                        bVar73 = ~(byte)(1 << ((uint)uVar64 & 0x1f)) & (byte)uVar68;
                        uVar137 = auVar216._0_4_;
                        auVar146._4_4_ = uVar137;
                        auVar146._0_4_ = uVar137;
                        auVar146._8_4_ = uVar137;
                        auVar146._12_4_ = uVar137;
                        auVar146._16_4_ = uVar137;
                        auVar146._20_4_ = uVar137;
                        auVar146._24_4_ = uVar137;
                        auVar146._28_4_ = uVar137;
                        uVar25 = vcmpps_avx512vl(auVar206._0_32_,auVar146,2);
                        if ((bVar73 & (byte)uVar25) == 0) goto LAB_01ad21b5;
                        bVar73 = bVar73 & (byte)uVar25;
                        uVar68 = (ulong)bVar73;
                        auVar147._8_4_ = 0x7f800000;
                        auVar147._0_8_ = 0x7f8000007f800000;
                        auVar147._12_4_ = 0x7f800000;
                        auVar147._16_4_ = 0x7f800000;
                        auVar147._20_4_ = 0x7f800000;
                        auVar147._24_4_ = 0x7f800000;
                        auVar147._28_4_ = 0x7f800000;
                        auVar101 = vblendmps_avx512vl(auVar147,auVar206._0_32_);
                        auVar126._0_4_ =
                             (uint)(bVar73 & 1) * auVar101._0_4_ |
                             (uint)!(bool)(bVar73 & 1) * 0x7f800000;
                        bVar12 = (bool)(bVar73 >> 1 & 1);
                        auVar126._4_4_ = (uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar73 >> 2 & 1);
                        auVar126._8_4_ = (uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar73 >> 3 & 1);
                        auVar126._12_4_ =
                             (uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar73 >> 4 & 1);
                        auVar126._16_4_ =
                             (uint)bVar12 * auVar101._16_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar73 >> 5 & 1);
                        auVar126._20_4_ =
                             (uint)bVar12 * auVar101._20_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar73 >> 6 & 1);
                        auVar126._24_4_ =
                             (uint)bVar12 * auVar101._24_4_ | (uint)!bVar12 * 0x7f800000;
                        auVar126._28_4_ =
                             (uint)(bVar73 >> 7) * auVar101._28_4_ |
                             (uint)!(bool)(bVar73 >> 7) * 0x7f800000;
                        auVar101 = vshufps_avx(auVar126,auVar126,0xb1);
                        auVar101 = vminps_avx(auVar126,auVar101);
                        auVar102 = vshufpd_avx(auVar101,auVar101,5);
                        auVar101 = vminps_avx(auVar101,auVar102);
                        auVar102 = vpermpd_avx2(auVar101,0x4e);
                        auVar101 = vminps_avx(auVar101,auVar102);
                        uVar25 = vcmpps_avx512vl(auVar126,auVar101,0);
                        bVar63 = (byte)uVar25 & bVar73;
                        if (bVar63 != 0) {
                          bVar73 = bVar63;
                        }
                        uVar65 = 0;
                        for (uVar66 = (uint)bVar73; (uVar66 & 1) == 0;
                            uVar66 = uVar66 >> 1 | 0x80000000) {
                          uVar65 = uVar65 + 1;
                        }
                        uVar64 = (ulong)uVar65;
                      } while( true );
                    }
                    fVar156 = local_1a0[uVar64];
                    uVar137 = *(undefined4 *)(local_180 + uVar64 * 4);
                    fVar150 = 1.0 - fVar156;
                    auVar18 = vfnmadd231ss_fma(ZEXT416((uint)(fVar156 * (fVar150 + fVar150))),
                                               ZEXT416((uint)fVar150),ZEXT416((uint)fVar150));
                    auVar139 = ZEXT416((uint)fVar156);
                    auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar139,
                                              ZEXT416(0xc0a00000));
                    auVar78 = vfmadd231ss_fma(ZEXT416((uint)(fVar156 * fVar156 * 3.0)),
                                              ZEXT416((uint)(fVar156 + fVar156)),auVar80);
                    auVar199 = ZEXT1664(auVar78);
                    auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar139,
                                              ZEXT416(0x40000000));
                    auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar150 * fVar150 * -3.0)),
                                              ZEXT416((uint)(fVar150 + fVar150)),auVar80);
                    auVar139 = vfmadd231ss_fma(ZEXT416((uint)(fVar156 * fVar156)),auVar139,
                                               ZEXT416((uint)(fVar150 * -2.0)));
                    fVar150 = auVar18._0_4_ * 0.5;
                    fVar151 = auVar78._0_4_ * 0.5;
                    auVar187 = ZEXT464((uint)fVar151);
                    fVar152 = auVar80._0_4_ * 0.5;
                    fVar164 = auVar139._0_4_ * 0.5;
                    auVar171._0_4_ = fVar164 * local_5f0;
                    auVar171._4_4_ = fVar164 * fStack_5ec;
                    auVar171._8_4_ = fVar164 * fStack_5e8;
                    auVar171._12_4_ = fVar164 * fStack_5e4;
                    auVar190._4_4_ = fVar152;
                    auVar190._0_4_ = fVar152;
                    auVar190._8_4_ = fVar152;
                    auVar190._12_4_ = fVar152;
                    auVar80 = vfmadd132ps_fma(auVar190,auVar171,auVar19);
                    auVar193 = ZEXT1664(auVar80);
                    auVar172._4_4_ = fVar151;
                    auVar172._0_4_ = fVar151;
                    auVar172._8_4_ = fVar151;
                    auVar172._12_4_ = fVar151;
                    auVar80 = vfmadd132ps_fma(auVar172,auVar80,auVar20);
                    auVar161._4_4_ = fVar150;
                    auVar161._0_4_ = fVar150;
                    auVar161._8_4_ = fVar150;
                    auVar161._12_4_ = fVar150;
                    auVar80 = vfmadd213ps_fma(auVar161,local_5b0,auVar80);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + uVar64 * 4);
                    *(int *)(ray + k * 4 + 0xc0) = auVar80._0_4_;
                    uVar10 = vextractps_avx(auVar80,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar10;
                    uVar10 = vextractps_avx(auVar80,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar10;
                    *(float *)(ray + k * 4 + 0xf0) = fVar156;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar137;
                    *(uint *)(ray + k * 4 + 0x110) = uVar9;
                    *(uint *)(ray + k * 4 + 0x120) = uVar69;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01ad1dbe;
      }
LAB_01ad1414:
      uVar137 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar28._4_4_ = uVar137;
      auVar28._0_4_ = uVar137;
      auVar28._8_4_ = uVar137;
      auVar28._12_4_ = uVar137;
      uVar24 = vcmpps_avx512vl(local_130,auVar28,2);
      uVar69 = (uint)uVar72 & (uint)uVar24;
      uVar72 = (ulong)uVar69;
    } while (uVar69 != 0);
  }
  return;
LAB_01ad21b5:
  auVar217 = ZEXT3264(local_480);
  auVar219 = ZEXT3264(local_4a0);
  auVar101 = vmovdqa64_avx512vl(local_100);
  auVar218 = ZEXT3264(auVar101);
  uVar72 = local_548;
  iVar67 = local_4e0._0_4_;
LAB_01ad1dbe:
  lVar70 = lVar70 + 8;
  if (iVar67 <= (int)lVar70) goto LAB_01ad1414;
  goto LAB_01ad14b9;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }